

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  byte bVar95;
  byte bVar96;
  ulong uVar97;
  uint uVar98;
  long lVar99;
  long lVar100;
  Geometry *pGVar101;
  uint uVar102;
  ulong uVar103;
  byte bVar104;
  float fVar105;
  float fVar106;
  float fVar157;
  float fVar159;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar163;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined4 uVar164;
  undefined8 uVar165;
  vint4 bi_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  vint4 bi_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar194;
  float fVar202;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  float fVar203;
  float fVar204;
  float fVar211;
  float fVar212;
  float fVar213;
  vint4 ai_2;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  vint4 ai;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_970;
  undefined8 uStack_968;
  RTCFilterFunctionNArguments local_960;
  Geometry *local_930;
  undefined1 (*local_928) [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined8 uStack_798;
  LinearSpace3fa *local_790;
  Primitive *local_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined4 local_640;
  int local_63c;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  byte local_5f0;
  float local_5e0 [4];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [64];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar97 = (ulong)(byte)PVar6;
  lVar37 = uVar97 * 0x25;
  fVar204 = *(float *)(prim + lVar37 + 0x12);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar111 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + lVar37 + 6));
  auVar195._0_4_ = fVar204 * auVar111._0_4_;
  auVar195._4_4_ = fVar204 * auVar111._4_4_;
  auVar195._8_4_ = fVar204 * auVar111._8_4_;
  auVar195._12_4_ = fVar204 * auVar111._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar166._0_4_ = fVar204 * auVar110._0_4_;
  auVar166._4_4_ = fVar204 * auVar110._4_4_;
  auVar166._8_4_ = fVar204 * auVar110._8_4_;
  auVar166._12_4_ = fVar204 * auVar110._12_4_;
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xf + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar97 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1b + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0x1c + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar215._4_4_ = auVar166._0_4_;
  auVar215._0_4_ = auVar166._0_4_;
  auVar215._8_4_ = auVar166._0_4_;
  auVar215._12_4_ = auVar166._0_4_;
  auVar33 = vshufps_avx(auVar166,auVar166,0x55);
  auVar113 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar204 = auVar113._0_4_;
  auVar185._0_4_ = fVar204 * auVar112._0_4_;
  fVar212 = auVar113._4_4_;
  auVar185._4_4_ = fVar212 * auVar112._4_4_;
  fVar203 = auVar113._8_4_;
  auVar185._8_4_ = fVar203 * auVar112._8_4_;
  fVar211 = auVar113._12_4_;
  auVar185._12_4_ = fVar211 * auVar112._12_4_;
  auVar181._0_4_ = auVar29._0_4_ * fVar204;
  auVar181._4_4_ = auVar29._4_4_ * fVar212;
  auVar181._8_4_ = auVar29._8_4_ * fVar203;
  auVar181._12_4_ = auVar29._12_4_ * fVar211;
  auVar167._0_4_ = auVar32._0_4_ * fVar204;
  auVar167._4_4_ = auVar32._4_4_ * fVar212;
  auVar167._8_4_ = auVar32._8_4_ * fVar203;
  auVar167._12_4_ = auVar32._12_4_ * fVar211;
  auVar113 = vfmadd231ps_fma(auVar185,auVar33,auVar110);
  auVar114 = vfmadd231ps_fma(auVar181,auVar33,auVar28);
  auVar33 = vfmadd231ps_fma(auVar167,auVar31,auVar33);
  auVar39 = vfmadd231ps_fma(auVar113,auVar215,auVar111);
  auVar114 = vfmadd231ps_fma(auVar114,auVar215,auVar27);
  auVar115 = vfmadd231ps_fma(auVar33,auVar30,auVar215);
  auVar237._4_4_ = auVar195._0_4_;
  auVar237._0_4_ = auVar195._0_4_;
  auVar237._8_4_ = auVar195._0_4_;
  auVar237._12_4_ = auVar195._0_4_;
  auVar33 = vshufps_avx(auVar195,auVar195,0x55);
  auVar113 = vshufps_avx(auVar195,auVar195,0xaa);
  fVar204 = auVar113._0_4_;
  auVar216._0_4_ = fVar204 * auVar112._0_4_;
  fVar212 = auVar113._4_4_;
  auVar216._4_4_ = fVar212 * auVar112._4_4_;
  fVar203 = auVar113._8_4_;
  auVar216._8_4_ = fVar203 * auVar112._8_4_;
  fVar211 = auVar113._12_4_;
  auVar216._12_4_ = fVar211 * auVar112._12_4_;
  auVar205._0_4_ = auVar29._0_4_ * fVar204;
  auVar205._4_4_ = auVar29._4_4_ * fVar212;
  auVar205._8_4_ = auVar29._8_4_ * fVar203;
  auVar205._12_4_ = auVar29._12_4_ * fVar211;
  auVar196._0_4_ = auVar32._0_4_ * fVar204;
  auVar196._4_4_ = auVar32._4_4_ * fVar212;
  auVar196._8_4_ = auVar32._8_4_ * fVar203;
  auVar196._12_4_ = auVar32._12_4_ * fVar211;
  auVar110 = vfmadd231ps_fma(auVar216,auVar33,auVar110);
  auVar112 = vfmadd231ps_fma(auVar205,auVar33,auVar28);
  auVar28 = vfmadd231ps_fma(auVar196,auVar33,auVar31);
  auVar40 = vfmadd231ps_fma(auVar110,auVar237,auVar111);
  auVar166 = vfmadd231ps_fma(auVar112,auVar237,auVar27);
  auVar229._8_4_ = 0x7fffffff;
  auVar229._0_8_ = 0x7fffffff7fffffff;
  auVar229._12_4_ = 0x7fffffff;
  auVar167 = vfmadd231ps_fma(auVar28,auVar237,auVar30);
  auVar111 = vandps_avx(auVar229,auVar39);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar13 = (bool)((byte)uVar103 & 1);
  auVar107._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._0_4_;
  bVar13 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._4_4_;
  bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._8_4_;
  bVar13 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._12_4_;
  auVar111 = vandps_avx(auVar229,auVar114);
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar13 = (bool)((byte)uVar103 & 1);
  auVar108._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar114._0_4_;
  bVar13 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar114._4_4_;
  bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar114._8_4_;
  bVar13 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar114._12_4_;
  auVar111 = vandps_avx(auVar229,auVar115);
  uVar103 = vcmpps_avx512vl(auVar111,auVar226,1);
  bVar13 = (bool)((byte)uVar103 & 1);
  auVar109._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar115._0_4_;
  bVar13 = (bool)((byte)(uVar103 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar115._4_4_;
  bVar13 = (bool)((byte)(uVar103 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar115._8_4_;
  bVar13 = (bool)((byte)(uVar103 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar115._12_4_;
  auVar110 = vrcp14ps_avx512vl(auVar107);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = &DAT_3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar111 = vfnmadd213ps_fma(auVar107,auVar110,auVar227);
  auVar39 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar111 = vfnmadd213ps_fma(auVar108,auVar110,auVar227);
  auVar115 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar109);
  auVar111 = vfnmadd213ps_fma(auVar109,auVar110,auVar227);
  auVar38 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
  fVar204 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar224._4_4_ = fVar204;
  auVar224._0_4_ = fVar204;
  auVar224._8_4_ = fVar204;
  auVar224._12_4_ = fVar204;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar110 = vpmovsxwd_avx(auVar110);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar27 = vsubps_avx(auVar110,auVar111);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar110 = vpmovsxwd_avx(auVar112);
  auVar112 = vfmadd213ps_fma(auVar27,auVar224,auVar111);
  auVar111 = vcvtdq2ps_avx(auVar110);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar97 * 0xd + 6);
  auVar110 = vpmovsxwd_avx(auVar27);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar27 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar97 * 0x12 + 6);
  auVar111 = vpmovsxwd_avx(auVar28);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar103 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar97 * 2 + uVar103 + 6);
  auVar110 = vpmovsxwd_avx(auVar29);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar28 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar111 = vpmovsxwd_avx(auVar30);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar97 * 0x18 + 6);
  auVar110 = vpmovsxwd_avx(auVar31);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar29 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar97 * 0x1d + 6);
  auVar111 = vpmovsxwd_avx(auVar32);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar97 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar110 = vpmovsxwd_avx(auVar33);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar30 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar97) + 6);
  auVar111 = vpmovsxwd_avx(auVar113);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar97 * 0x23 + 6);
  auVar110 = vpmovsxwd_avx(auVar114);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar111);
  auVar110 = vfmadd213ps_fma(auVar110,auVar224,auVar111);
  auVar111 = vsubps_avx(auVar112,auVar40);
  auVar225._0_4_ = auVar39._0_4_ * auVar111._0_4_;
  auVar225._4_4_ = auVar39._4_4_ * auVar111._4_4_;
  auVar225._8_4_ = auVar39._8_4_ * auVar111._8_4_;
  auVar225._12_4_ = auVar39._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar27,auVar40);
  auVar186._0_4_ = auVar39._0_4_ * auVar111._0_4_;
  auVar186._4_4_ = auVar39._4_4_ * auVar111._4_4_;
  auVar186._8_4_ = auVar39._8_4_ * auVar111._8_4_;
  auVar186._12_4_ = auVar39._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar28,auVar166);
  auVar217._0_4_ = auVar115._0_4_ * auVar111._0_4_;
  auVar217._4_4_ = auVar115._4_4_ * auVar111._4_4_;
  auVar217._8_4_ = auVar115._8_4_ * auVar111._8_4_;
  auVar217._12_4_ = auVar115._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar29,auVar166);
  auVar182._0_4_ = auVar115._0_4_ * auVar111._0_4_;
  auVar182._4_4_ = auVar115._4_4_ * auVar111._4_4_;
  auVar182._8_4_ = auVar115._8_4_ * auVar111._8_4_;
  auVar182._12_4_ = auVar115._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar30,auVar167);
  auVar206._0_4_ = auVar38._0_4_ * auVar111._0_4_;
  auVar206._4_4_ = auVar38._4_4_ * auVar111._4_4_;
  auVar206._8_4_ = auVar38._8_4_ * auVar111._8_4_;
  auVar206._12_4_ = auVar38._12_4_ * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar110,auVar167);
  auVar168._0_4_ = auVar38._0_4_ * auVar111._0_4_;
  auVar168._4_4_ = auVar38._4_4_ * auVar111._4_4_;
  auVar168._8_4_ = auVar38._8_4_ * auVar111._8_4_;
  auVar168._12_4_ = auVar38._12_4_ * auVar111._12_4_;
  auVar111 = vpminsd_avx(auVar225,auVar186);
  auVar110 = vpminsd_avx(auVar217,auVar182);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar110 = vpminsd_avx(auVar206,auVar168);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar39._4_4_ = uVar164;
  auVar39._0_4_ = uVar164;
  auVar39._8_4_ = uVar164;
  auVar39._12_4_ = uVar164;
  auVar110 = vmaxps_avx512vl(auVar110,auVar39);
  auVar111 = vmaxps_avx(auVar111,auVar110);
  auVar115._8_4_ = 0x3f7ffffa;
  auVar115._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar115._12_4_ = 0x3f7ffffa;
  local_4f0 = vmulps_avx512vl(auVar111,auVar115);
  auVar111 = vpmaxsd_avx(auVar225,auVar186);
  auVar110 = vpmaxsd_avx(auVar217,auVar182);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar110 = vpmaxsd_avx(auVar206,auVar168);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar38._4_4_ = uVar164;
  auVar38._0_4_ = uVar164;
  auVar38._8_4_ = uVar164;
  auVar38._12_4_ = uVar164;
  auVar110 = vminps_avx512vl(auVar110,auVar38);
  auVar111 = vminps_avx(auVar111,auVar110);
  auVar40._8_4_ = 0x3f800003;
  auVar40._0_8_ = 0x3f8000033f800003;
  auVar40._12_4_ = 0x3f800003;
  auVar111 = vmulps_avx512vl(auVar111,auVar40);
  auVar110 = vpbroadcastd_avx512vl();
  uVar165 = vcmpps_avx512vl(local_4f0,auVar111,2);
  uVar103 = vpcmpgtd_avx512vl(auVar110,_DAT_01ff0cf0);
  uVar103 = ((byte)uVar165 & 0xf) & uVar103;
  if ((char)uVar103 != '\0') {
    local_790 = pre->ray_space + k;
    local_928 = (undefined1 (*) [32])local_100;
    auVar180 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar180);
    local_788 = prim;
    do {
      lVar37 = 0;
      for (uVar97 = uVar103; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar102 = *(uint *)(local_788 + 2);
      uVar7 = *(uint *)(local_788 + lVar37 * 4 + 6);
      pGVar101 = (context->scene->geometries).items[uVar102].ptr;
      uVar97 = (ulong)*(uint *)(*(long *)&pGVar101->field_0x58 +
                               (ulong)uVar7 *
                               pGVar101[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar204 = (pGVar101->time_range).lower;
      fVar204 = pGVar101->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar204) /
                ((pGVar101->time_range).upper - fVar204));
      auVar111 = vroundss_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),9);
      auVar111 = vminss_avx(auVar111,ZEXT416((uint)(pGVar101->fnumTimeSegments + -1.0)));
      auVar111 = vmaxss_avx(ZEXT816(0) << 0x20,auVar111);
      fVar204 = fVar204 - auVar111._0_4_;
      _Var10 = pGVar101[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar100 = (long)(int)auVar111._0_4_ * 0x38;
      lVar37 = *(long *)(_Var10 + 0x10 + lVar100);
      lVar99 = *(long *)(_Var10 + 0x38 + lVar100);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar100);
      auVar183._4_4_ = fVar204;
      auVar183._0_4_ = fVar204;
      auVar183._8_4_ = fVar204;
      auVar183._12_4_ = fVar204;
      pfVar3 = (float *)(lVar99 + uVar97 * lVar11);
      auVar230._0_4_ = fVar204 * *pfVar3;
      auVar230._4_4_ = fVar204 * pfVar3[1];
      auVar230._8_4_ = fVar204 * pfVar3[2];
      auVar230._12_4_ = fVar204 * pfVar3[3];
      pfVar3 = (float *)(lVar99 + (uVar97 + 1) * lVar11);
      auVar231._0_4_ = fVar204 * *pfVar3;
      auVar231._4_4_ = fVar204 * pfVar3[1];
      auVar231._8_4_ = fVar204 * pfVar3[2];
      auVar231._12_4_ = fVar204 * pfVar3[3];
      auVar111 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar99 + (uVar97 + 2) * lVar11));
      auVar110 = vmulps_avx512vl(auVar183,*(undefined1 (*) [16])(lVar99 + lVar11 * (uVar97 + 3)));
      lVar99 = *(long *)(_Var10 + lVar100);
      fVar204 = 1.0 - fVar204;
      auVar169._4_4_ = fVar204;
      auVar169._0_4_ = fVar204;
      auVar169._8_4_ = fVar204;
      auVar169._12_4_ = fVar204;
      auVar27 = vfmadd231ps_fma(auVar230,auVar169,*(undefined1 (*) [16])(lVar99 + lVar37 * uVar97));
      local_8b0 = vfmadd231ps_fma(auVar231,auVar169,
                                  *(undefined1 (*) [16])(lVar99 + lVar37 * (uVar97 + 1)));
      local_8c0 = vfmadd231ps_avx512vl
                            (auVar111,auVar169,
                             *(undefined1 (*) [16])(lVar99 + lVar37 * (uVar97 + 2)));
      _local_8d0 = vfmadd231ps_avx512vl
                             (auVar110,auVar169,
                              *(undefined1 (*) [16])(lVar99 + lVar37 * (uVar97 + 3)));
      iVar8 = (int)pGVar101[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      lVar37 = (long)iVar8 * 0x44;
      auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar112 = vsubps_avx(auVar27,auVar111);
      uVar164 = auVar112._0_4_;
      auVar187._4_4_ = uVar164;
      auVar187._0_4_ = uVar164;
      auVar187._8_4_ = uVar164;
      auVar187._12_4_ = uVar164;
      auVar110 = vshufps_avx(auVar112,auVar112,0x55);
      aVar4 = (local_790->vx).field_0;
      aVar5 = (local_790->vy).field_0;
      fVar204 = (local_790->vz).field_0.m128[0];
      fVar212 = *(float *)((long)&(local_790->vz).field_0 + 4);
      fVar203 = *(float *)((long)&(local_790->vz).field_0 + 8);
      fVar211 = *(float *)((long)&(local_790->vz).field_0 + 0xc);
      auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar233._0_4_ = fVar204 * auVar112._0_4_;
      auVar233._4_4_ = fVar212 * auVar112._4_4_;
      auVar233._8_4_ = fVar203 * auVar112._8_4_;
      auVar233._12_4_ = fVar211 * auVar112._12_4_;
      auVar110 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar110);
      auVar28 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar187);
      auVar112 = vsubps_avx(local_8b0,auVar111);
      uVar164 = auVar112._0_4_;
      auVar188._4_4_ = uVar164;
      auVar188._0_4_ = uVar164;
      auVar188._8_4_ = uVar164;
      auVar188._12_4_ = uVar164;
      auVar110 = vshufps_avx(auVar112,auVar112,0x55);
      auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar234._0_4_ = fVar204 * auVar112._0_4_;
      auVar234._4_4_ = fVar212 * auVar112._4_4_;
      auVar234._8_4_ = fVar203 * auVar112._8_4_;
      auVar234._12_4_ = fVar211 * auVar112._12_4_;
      auVar110 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar110);
      auVar29 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar188);
      auVar112 = vsubps_avx512vl(local_8c0,auVar111);
      uVar164 = auVar112._0_4_;
      auVar189._4_4_ = uVar164;
      auVar189._0_4_ = uVar164;
      auVar189._8_4_ = uVar164;
      auVar189._12_4_ = uVar164;
      auVar110 = vshufps_avx(auVar112,auVar112,0x55);
      auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar235._0_4_ = fVar204 * auVar112._0_4_;
      auVar235._4_4_ = fVar212 * auVar112._4_4_;
      auVar235._8_4_ = fVar203 * auVar112._8_4_;
      auVar235._12_4_ = fVar211 * auVar112._12_4_;
      auVar110 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar110);
      auVar112 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar189);
      auVar110 = vsubps_avx512vl(_local_8d0,auVar111);
      uVar164 = auVar110._0_4_;
      auVar184._4_4_ = uVar164;
      auVar184._0_4_ = uVar164;
      auVar184._8_4_ = uVar164;
      auVar184._12_4_ = uVar164;
      auVar111 = vshufps_avx(auVar110,auVar110,0x55);
      auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
      auVar239._0_4_ = fVar204 * auVar110._0_4_;
      auVar239._4_4_ = fVar212 * auVar110._4_4_;
      auVar239._8_4_ = fVar203 * auVar110._8_4_;
      auVar239._12_4_ = fVar211 * auVar110._12_4_;
      auVar111 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar5,auVar111);
      auVar30 = vfmadd231ps_fma(auVar111,(undefined1  [16])aVar4,auVar184);
      auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar37);
      uVar164 = auVar28._0_4_;
      local_720._4_4_ = uVar164;
      local_720._0_4_ = uVar164;
      local_720._8_4_ = uVar164;
      local_720._12_4_ = uVar164;
      local_720._16_4_ = uVar164;
      local_720._20_4_ = uVar164;
      local_720._24_4_ = uVar164;
      local_720._28_4_ = uVar164;
      auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x484);
      auVar116._8_4_ = 1;
      auVar116._0_8_ = 0x100000001;
      auVar116._12_4_ = 1;
      auVar116._16_4_ = 1;
      auVar116._20_4_ = 1;
      auVar116._24_4_ = 1;
      auVar116._28_4_ = 1;
      local_700 = vpermps_avx2(auVar116,ZEXT1632(auVar28));
      local_740 = vbroadcastss_avx512vl(auVar29);
      local_900 = vpermps_avx512vl(auVar116,ZEXT1632(auVar29));
      auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x908);
      local_920 = vbroadcastss_avx512vl(auVar112);
      local_7e0 = vpermps_avx512vl(auVar116,ZEXT1632(auVar112));
      auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0xd8c);
      local_800 = vbroadcastss_avx512vl(auVar30);
      auVar180 = ZEXT3264(local_800);
      local_820 = vpermps_avx512vl(auVar116,ZEXT1632(auVar30));
      auVar248 = ZEXT3264(local_820);
      auVar116 = vmulps_avx512vl(local_800,auVar128);
      auVar117 = vmulps_avx512vl(local_820,auVar128);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar129,local_920);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar129,local_7e0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar133,local_740);
      auVar118 = vfmadd231ps_avx512vl(auVar117,auVar133,local_900);
      auVar119 = vfmadd231ps_avx512vl(auVar116,auVar131,local_720);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar37);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x484);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x908);
      auVar120 = vfmadd231ps_avx512vl(auVar118,auVar131,local_700);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0xd8c);
      auVar121 = vmulps_avx512vl(local_800,auVar118);
      auVar122 = vmulps_avx512vl(local_820,auVar118);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_920);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,local_7e0);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,local_740);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar117,local_900);
      auVar31 = vfmadd231ps_fma(auVar121,auVar116,local_720);
      auVar32 = vfmadd231ps_fma(auVar122,auVar116,local_700);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar31),auVar119);
      auVar123 = vsubps_avx512vl(ZEXT1632(auVar32),auVar120);
      auVar121 = vmulps_avx512vl(auVar120,auVar122);
      auVar124 = vmulps_avx512vl(auVar119,auVar123);
      auVar121 = vsubps_avx512vl(auVar121,auVar124);
      auVar111 = vshufps_avx(auVar27,auVar27,0xff);
      uVar165 = auVar111._0_8_;
      local_320._8_8_ = uVar165;
      local_320._0_8_ = uVar165;
      local_320._16_8_ = uVar165;
      local_320._24_8_ = uVar165;
      auVar111 = vshufps_avx(local_8b0,local_8b0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar111);
      auVar111 = vshufps_avx512vl(local_8c0,local_8c0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar111);
      auVar111 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar165 = auVar111._0_8_;
      register0x00001248 = uVar165;
      local_380 = uVar165;
      register0x00001250 = uVar165;
      register0x00001258 = uVar165;
      auVar124 = vmulps_avx512vl(_local_380,auVar128);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar129,local_360);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar133,local_340);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar131,local_320);
      auVar125 = vmulps_avx512vl(_local_380,auVar118);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar127,local_360);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar117,local_340);
      auVar33 = vfmadd231ps_fma(auVar125,auVar116,local_320);
      auVar125 = vmulps_avx512vl(auVar123,auVar123);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar122,auVar122);
      auVar126 = vmaxps_avx512vl(auVar124,ZEXT1632(auVar33));
      auVar126 = vmulps_avx512vl(auVar126,auVar126);
      auVar125 = vmulps_avx512vl(auVar126,auVar125);
      auVar121 = vmulps_avx512vl(auVar121,auVar121);
      uVar165 = vcmpps_avx512vl(auVar121,auVar125,2);
      auVar111 = vblendps_avx(auVar28,auVar27,8);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar110 = vandps_avx512vl(auVar111,auVar113);
      auVar111 = vblendps_avx(auVar29,local_8b0,8);
      auVar111 = vandps_avx512vl(auVar111,auVar113);
      auVar110 = vmaxps_avx(auVar110,auVar111);
      auVar111 = vblendps_avx(auVar112,local_8c0,8);
      auVar114 = vandps_avx512vl(auVar111,auVar113);
      auVar111 = vblendps_avx(auVar30,_local_8d0,8);
      auVar111 = vandps_avx512vl(auVar111,auVar113);
      auVar111 = vmaxps_avx(auVar114,auVar111);
      auVar111 = vmaxps_avx(auVar110,auVar111);
      auVar110 = vmovshdup_avx(auVar111);
      auVar110 = vmaxss_avx(auVar110,auVar111);
      auVar111 = vshufpd_avx(auVar111,auVar111,1);
      auVar111 = vmaxss_avx(auVar111,auVar110);
      _local_6c0 = vcvtsi2ss_avx512f(local_8c0,iVar8);
      auVar125._0_4_ = local_6c0._0_4_;
      auVar125._4_4_ = auVar125._0_4_;
      auVar125._8_4_ = auVar125._0_4_;
      auVar125._12_4_ = auVar125._0_4_;
      auVar125._16_4_ = auVar125._0_4_;
      auVar125._20_4_ = auVar125._0_4_;
      auVar125._24_4_ = auVar125._0_4_;
      auVar125._28_4_ = auVar125._0_4_;
      uVar34 = vcmpps_avx512vl(auVar125,_DAT_02020f40,0xe);
      bVar104 = (byte)uVar165 & (byte)uVar34;
      fVar212 = auVar111._0_4_ * 4.7683716e-07;
      auVar121._8_4_ = 2;
      auVar121._0_8_ = 0x200000002;
      auVar121._12_4_ = 2;
      auVar121._16_4_ = 2;
      auVar121._20_4_ = 2;
      auVar121._24_4_ = 2;
      auVar121._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar121,ZEXT1632(auVar28));
      local_3c0 = vpermps_avx512vl(auVar121,ZEXT1632(auVar29));
      local_3e0 = vpermps_avx512vl(auVar121,ZEXT1632(auVar112));
      auVar121 = vpermps_avx2(auVar121,ZEXT1632(auVar30));
      fVar204 = *(float *)(ray + k * 4 + 0xc0);
      auVar111 = auVar123._0_16_;
      _local_8e0 = ZEXT416((uint)fVar212);
      local_970 = auVar27._0_8_;
      uStack_968 = auVar27._8_8_;
      if (bVar104 == 0) {
        auVar111 = vxorps_avx512vl(auVar111,auVar111);
        auVar246 = ZEXT1664(auVar111);
        auVar243 = ZEXT3264(local_720);
        auVar244 = ZEXT3264(local_700);
        auVar245 = ZEXT3264(local_740);
        auVar242 = ZEXT3264(local_900);
        auVar249 = ZEXT3264(local_920);
        auVar247 = ZEXT3264(local_7e0);
      }
      else {
        fStack_77c = 0.0;
        fStack_778 = 0.0;
        fStack_774 = 0.0;
        auVar118 = vmulps_avx512vl(auVar121,auVar118);
        auVar127 = vfmadd213ps_avx512vl(auVar127,local_3e0,auVar118);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_3c0,auVar127);
        auVar126 = vfmadd213ps_avx512vl(auVar116,local_3a0,auVar117);
        auVar128 = vmulps_avx512vl(auVar121,auVar128);
        auVar129 = vfmadd213ps_avx512vl(auVar129,local_3e0,auVar128);
        auVar117 = vfmadd213ps_avx512vl(auVar133,local_3c0,auVar129);
        auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1210);
        auVar129 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1694);
        auVar128 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1f9c);
        auVar130 = vfmadd213ps_avx512vl(auVar131,local_3a0,auVar117);
        auVar131 = vmulps_avx512vl(local_800,auVar116);
        auVar117 = vmulps_avx512vl(local_820,auVar116);
        auVar236._0_4_ = auVar121._0_4_ * auVar116._0_4_;
        auVar236._4_4_ = auVar121._4_4_ * auVar116._4_4_;
        auVar236._8_4_ = auVar121._8_4_ * auVar116._8_4_;
        auVar236._12_4_ = auVar121._12_4_ * auVar116._12_4_;
        auVar236._16_4_ = auVar121._16_4_ * auVar116._16_4_;
        auVar236._20_4_ = auVar121._20_4_ * auVar116._20_4_;
        auVar236._24_4_ = auVar121._24_4_ * auVar116._24_4_;
        auVar236._28_4_ = 0;
        auVar249 = ZEXT3264(local_920);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar128,local_920);
        auVar116 = vfmadd231ps_avx512vl(auVar117,auVar128,local_7e0);
        auVar128 = vfmadd231ps_avx512vl(auVar236,local_3e0,auVar128);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar129,local_740);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar129,local_900);
        auVar117 = vfmadd231ps_avx512vl(auVar128,local_3c0,auVar129);
        auVar127 = vfmadd231ps_avx512vl(auVar131,auVar133,local_720);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar133,local_700);
        auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1210);
        auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1b18);
        auVar128 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1f9c);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_3a0,auVar133);
        auVar118 = vmulps_avx512vl(local_800,auVar128);
        auVar132 = vmulps_avx512vl(local_820,auVar128);
        auVar133._4_4_ = auVar121._4_4_ * auVar128._4_4_;
        auVar133._0_4_ = auVar121._0_4_ * auVar128._0_4_;
        auVar133._8_4_ = auVar121._8_4_ * auVar128._8_4_;
        auVar133._12_4_ = auVar121._12_4_ * auVar128._12_4_;
        auVar133._16_4_ = auVar121._16_4_ * auVar128._16_4_;
        auVar133._20_4_ = auVar121._20_4_ * auVar128._20_4_;
        auVar133._24_4_ = auVar121._24_4_ * auVar128._24_4_;
        auVar133._28_4_ = auVar128._28_4_;
        auVar128 = vfmadd231ps_avx512vl(auVar118,auVar129,local_920);
        auVar118 = vfmadd231ps_avx512vl(auVar132,auVar129,local_7e0);
        auVar129 = vfmadd231ps_avx512vl(auVar133,local_3e0,auVar129);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1694);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar133,local_740);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar133,local_900);
        auVar133 = vfmadd231ps_avx512vl(auVar129,local_3c0,auVar133);
        auVar129 = vfmadd231ps_avx512vl(auVar128,auVar131,local_720);
        auVar128 = vfmadd231ps_avx512vl(auVar118,auVar131,local_700);
        auVar118 = vfmadd231ps_avx512vl(auVar133,local_3a0,auVar131);
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar131 = vandps_avx(auVar127,auVar240);
        auVar133 = vandps_avx(auVar116,auVar240);
        auVar133 = vmaxps_avx(auVar131,auVar133);
        auVar131 = vandps_avx(auVar117,auVar240);
        auVar131 = vmaxps_avx(auVar133,auVar131);
        auVar117 = vbroadcastss_avx512vl(_local_8e0);
        uVar97 = vcmpps_avx512vl(auVar131,auVar117,1);
        bVar13 = (bool)((byte)uVar97 & 1);
        auVar132._0_4_ = (float)((uint)bVar13 * auVar122._0_4_ | (uint)!bVar13 * auVar127._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar127._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar127._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar127._12_4_);
        bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar132._16_4_ = (float)((uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar127._16_4_);
        bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar132._20_4_ = (float)((uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar127._20_4_);
        bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar132._24_4_ = (float)((uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar127._24_4_);
        bVar13 = SUB81(uVar97 >> 7,0);
        auVar132._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar127._28_4_;
        bVar13 = (bool)((byte)uVar97 & 1);
        auVar134._0_4_ = (float)((uint)bVar13 * auVar123._0_4_ | (uint)!bVar13 * auVar116._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar116._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar116._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar116._12_4_);
        bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * auVar116._16_4_);
        bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * auVar116._20_4_);
        bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * auVar116._24_4_);
        bVar13 = SUB81(uVar97 >> 7,0);
        auVar134._28_4_ = (uint)bVar13 * auVar123._28_4_ | (uint)!bVar13 * auVar116._28_4_;
        auVar131 = vandps_avx(auVar240,auVar129);
        auVar133 = vandps_avx(auVar128,auVar240);
        auVar133 = vmaxps_avx(auVar131,auVar133);
        auVar131 = vandps_avx(auVar118,auVar240);
        auVar131 = vmaxps_avx(auVar133,auVar131);
        uVar97 = vcmpps_avx512vl(auVar131,auVar117,1);
        bVar13 = (bool)((byte)uVar97 & 1);
        auVar135._0_4_ = (float)((uint)bVar13 * auVar122._0_4_ | (uint)!bVar13 * auVar129._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar129._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar129._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar129._12_4_);
        bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar129._16_4_);
        bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar129._20_4_);
        bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar129._24_4_);
        bVar13 = SUB81(uVar97 >> 7,0);
        auVar135._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar129._28_4_;
        bVar13 = (bool)((byte)uVar97 & 1);
        auVar136._0_4_ = (float)((uint)bVar13 * auVar123._0_4_ | (uint)!bVar13 * auVar128._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar136._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar128._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar136._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar128._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar136._12_4_ = (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar128._12_4_);
        bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar136._16_4_ = (float)((uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * auVar128._16_4_);
        bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar136._20_4_ = (float)((uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * auVar128._20_4_);
        bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar136._24_4_ = (float)((uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * auVar128._24_4_);
        bVar13 = SUB81(uVar97 >> 7,0);
        auVar136._28_4_ = (uint)bVar13 * auVar123._28_4_ | (uint)!bVar13 * auVar128._28_4_;
        auVar115 = vxorps_avx512vl(auVar111,auVar111);
        auVar246 = ZEXT1664(auVar115);
        auVar131 = vfmadd213ps_avx512vl(auVar132,auVar132,ZEXT1632(auVar115));
        auVar111 = vfmadd231ps_fma(auVar131,auVar134,auVar134);
        auVar133 = vrsqrt14ps_avx512vl(ZEXT1632(auVar111));
        fVar203 = auVar133._0_4_;
        fVar211 = auVar133._4_4_;
        fVar213 = auVar133._8_4_;
        fVar214 = auVar133._12_4_;
        fVar194 = auVar133._16_4_;
        fVar202 = auVar133._20_4_;
        fVar105 = auVar133._24_4_;
        auVar131._4_4_ = fVar211 * fVar211 * fVar211 * auVar111._4_4_ * -0.5;
        auVar131._0_4_ = fVar203 * fVar203 * fVar203 * auVar111._0_4_ * -0.5;
        auVar131._8_4_ = fVar213 * fVar213 * fVar213 * auVar111._8_4_ * -0.5;
        auVar131._12_4_ = fVar214 * fVar214 * fVar214 * auVar111._12_4_ * -0.5;
        auVar131._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
        auVar131._20_4_ = fVar202 * fVar202 * fVar202 * -0.0;
        auVar131._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar131._28_4_ = auVar118._28_4_;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar116,auVar133);
        auVar129._4_4_ = auVar134._4_4_ * auVar131._4_4_;
        auVar129._0_4_ = auVar134._0_4_ * auVar131._0_4_;
        auVar129._8_4_ = auVar134._8_4_ * auVar131._8_4_;
        auVar129._12_4_ = auVar134._12_4_ * auVar131._12_4_;
        auVar129._16_4_ = auVar134._16_4_ * auVar131._16_4_;
        auVar129._20_4_ = auVar134._20_4_ * auVar131._20_4_;
        auVar129._24_4_ = auVar134._24_4_ * auVar131._24_4_;
        auVar129._28_4_ = 0;
        auVar128._4_4_ = auVar131._4_4_ * -auVar132._4_4_;
        auVar128._0_4_ = auVar131._0_4_ * -auVar132._0_4_;
        auVar128._8_4_ = auVar131._8_4_ * -auVar132._8_4_;
        auVar128._12_4_ = auVar131._12_4_ * -auVar132._12_4_;
        auVar128._16_4_ = auVar131._16_4_ * -auVar132._16_4_;
        auVar128._20_4_ = auVar131._20_4_ * -auVar132._20_4_;
        auVar128._24_4_ = auVar131._24_4_ * -auVar132._24_4_;
        auVar128._28_4_ = auVar134._28_4_;
        auVar131 = vmulps_avx512vl(auVar131,ZEXT1632(auVar115));
        auVar122 = ZEXT1632(auVar115);
        auVar133 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar122);
        auVar111 = vfmadd231ps_fma(auVar133,auVar136,auVar136);
        auVar133 = vrsqrt14ps_avx512vl(ZEXT1632(auVar111));
        fVar203 = auVar133._0_4_;
        fVar211 = auVar133._4_4_;
        fVar213 = auVar133._8_4_;
        fVar214 = auVar133._12_4_;
        fVar194 = auVar133._16_4_;
        fVar202 = auVar133._20_4_;
        fVar105 = auVar133._24_4_;
        auVar117._4_4_ = fVar211 * fVar211 * fVar211 * auVar111._4_4_ * -0.5;
        auVar117._0_4_ = fVar203 * fVar203 * fVar203 * auVar111._0_4_ * -0.5;
        auVar117._8_4_ = fVar213 * fVar213 * fVar213 * auVar111._8_4_ * -0.5;
        auVar117._12_4_ = fVar214 * fVar214 * fVar214 * auVar111._12_4_ * -0.5;
        auVar117._16_4_ = fVar194 * fVar194 * fVar194 * -0.0;
        auVar117._20_4_ = fVar202 * fVar202 * fVar202 * -0.0;
        auVar117._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
        auVar117._28_4_ = 0;
        auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar133);
        auVar127._4_4_ = auVar136._4_4_ * auVar116._4_4_;
        auVar127._0_4_ = auVar136._0_4_ * auVar116._0_4_;
        auVar127._8_4_ = auVar136._8_4_ * auVar116._8_4_;
        auVar127._12_4_ = auVar136._12_4_ * auVar116._12_4_;
        auVar127._16_4_ = auVar136._16_4_ * auVar116._16_4_;
        auVar127._20_4_ = auVar136._20_4_ * auVar116._20_4_;
        auVar127._24_4_ = auVar136._24_4_ * auVar116._24_4_;
        auVar127._28_4_ = auVar133._28_4_;
        auVar118._4_4_ = -auVar135._4_4_ * auVar116._4_4_;
        auVar118._0_4_ = -auVar135._0_4_ * auVar116._0_4_;
        auVar118._8_4_ = -auVar135._8_4_ * auVar116._8_4_;
        auVar118._12_4_ = -auVar135._12_4_ * auVar116._12_4_;
        auVar118._16_4_ = -auVar135._16_4_ * auVar116._16_4_;
        auVar118._20_4_ = -auVar135._20_4_ * auVar116._20_4_;
        auVar118._24_4_ = -auVar135._24_4_ * auVar116._24_4_;
        auVar118._28_4_ = auVar135._28_4_ ^ 0x80000000;
        auVar133 = vmulps_avx512vl(auVar116,auVar122);
        auVar111 = vfmadd213ps_fma(auVar129,auVar124,auVar119);
        auVar110 = vfmadd213ps_fma(auVar128,auVar124,auVar120);
        auVar116 = vfmadd213ps_avx512vl(auVar131,auVar124,auVar130);
        auVar117 = vfmadd213ps_avx512vl(auVar127,ZEXT1632(auVar33),ZEXT1632(auVar31));
        auVar113 = vfnmadd213ps_fma(auVar129,auVar124,auVar119);
        auVar119 = ZEXT1632(auVar33);
        auVar112 = vfmadd213ps_fma(auVar118,auVar119,ZEXT1632(auVar32));
        auVar114 = vfnmadd213ps_fma(auVar128,auVar124,auVar120);
        auVar28 = vfmadd213ps_fma(auVar133,auVar119,auVar126);
        auVar129 = vfnmadd231ps_avx512vl(auVar130,auVar124,auVar131);
        auVar31 = vfnmadd213ps_fma(auVar127,auVar119,ZEXT1632(auVar31));
        auVar32 = vfnmadd213ps_fma(auVar118,auVar119,ZEXT1632(auVar32));
        auVar39 = vfnmadd231ps_fma(auVar126,ZEXT1632(auVar33),auVar133);
        auVar133 = vsubps_avx512vl(auVar117,ZEXT1632(auVar113));
        auVar131 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar114));
        auVar128 = vsubps_avx512vl(ZEXT1632(auVar28),auVar129);
        auVar127 = vmulps_avx512vl(auVar131,auVar129);
        auVar29 = vfmsub231ps_fma(auVar127,ZEXT1632(auVar114),auVar128);
        auVar119._4_4_ = auVar113._4_4_ * auVar128._4_4_;
        auVar119._0_4_ = auVar113._0_4_ * auVar128._0_4_;
        auVar119._8_4_ = auVar113._8_4_ * auVar128._8_4_;
        auVar119._12_4_ = auVar113._12_4_ * auVar128._12_4_;
        auVar119._16_4_ = auVar128._16_4_ * 0.0;
        auVar119._20_4_ = auVar128._20_4_ * 0.0;
        auVar119._24_4_ = auVar128._24_4_ * 0.0;
        auVar119._28_4_ = auVar128._28_4_;
        auVar128 = vfmsub231ps_avx512vl(auVar119,auVar129,auVar133);
        auVar120._4_4_ = auVar114._4_4_ * auVar133._4_4_;
        auVar120._0_4_ = auVar114._0_4_ * auVar133._0_4_;
        auVar120._8_4_ = auVar114._8_4_ * auVar133._8_4_;
        auVar120._12_4_ = auVar114._12_4_ * auVar133._12_4_;
        auVar120._16_4_ = auVar133._16_4_ * 0.0;
        auVar120._20_4_ = auVar133._20_4_ * 0.0;
        auVar120._24_4_ = auVar133._24_4_ * 0.0;
        auVar120._28_4_ = auVar133._28_4_;
        auVar30 = vfmsub231ps_fma(auVar120,ZEXT1632(auVar113),auVar131);
        auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar30),auVar122,auVar128);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar122,ZEXT1632(auVar29));
        auVar132 = ZEXT1632(auVar115);
        uVar97 = vcmpps_avx512vl(auVar131,auVar132,2);
        bVar96 = (byte)uVar97;
        fVar105 = (float)((uint)(bVar96 & 1) * auVar111._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar31._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar157 = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar31._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar159 = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar31._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar161 = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar31._12_4_);
        auVar127 = ZEXT1632(CONCAT412(fVar161,CONCAT48(fVar159,CONCAT44(fVar157,fVar105))));
        fVar106 = (float)((uint)(bVar96 & 1) * auVar110._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar32._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar158 = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar32._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar160 = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar32._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar162 = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar32._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar160,CONCAT44(fVar158,fVar106))));
        auVar130._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar39._0_4_
                    );
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar39._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar39._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar39._12_4_);
        fVar211 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar116._16_4_);
        auVar130._16_4_ = fVar211;
        fVar203 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar116._20_4_);
        auVar130._20_4_ = fVar203;
        fVar213 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar116._24_4_);
        auVar130._24_4_ = fVar213;
        iVar1 = (uint)(byte)(uVar97 >> 7) * auVar116._28_4_;
        auVar130._28_4_ = iVar1;
        auVar133 = vblendmps_avx512vl(ZEXT1632(auVar113),auVar117);
        auVar137._0_4_ =
             (uint)(bVar96 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar29._0_4_;
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar13 * auVar133._4_4_ | (uint)!bVar13 * auVar29._4_4_;
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar13 * auVar133._8_4_ | (uint)!bVar13 * auVar29._8_4_;
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar13 * auVar133._12_4_ | (uint)!bVar13 * auVar29._12_4_;
        auVar137._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar133._16_4_;
        auVar137._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar133._20_4_;
        auVar137._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar133._24_4_;
        auVar137._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar133._28_4_;
        auVar133 = vblendmps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar112));
        auVar138._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar133._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar110._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar13 * auVar133._4_4_ | (uint)!bVar13 * auVar110._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar13 * auVar133._8_4_ | (uint)!bVar13 * auVar110._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar13 * auVar133._12_4_ | (uint)!bVar13 * auVar110._12_4_);
        fVar214 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar133._16_4_);
        auVar138._16_4_ = fVar214;
        fVar194 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar133._20_4_);
        auVar138._20_4_ = fVar194;
        fVar202 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar133._24_4_);
        auVar138._24_4_ = fVar202;
        auVar138._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar133._28_4_;
        auVar133 = vblendmps_avx512vl(auVar129,ZEXT1632(auVar28));
        auVar139._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar133._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar116._0_4_);
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar13 * auVar133._4_4_ | (uint)!bVar13 * auVar116._4_4_);
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar13 * auVar133._8_4_ | (uint)!bVar13 * auVar116._8_4_);
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar13 * auVar133._12_4_ | (uint)!bVar13 * auVar116._12_4_);
        bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar13 * auVar133._16_4_ | (uint)!bVar13 * auVar116._16_4_);
        bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar13 * auVar133._20_4_ | (uint)!bVar13 * auVar116._20_4_);
        bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar13 * auVar133._24_4_ | (uint)!bVar13 * auVar116._24_4_);
        bVar13 = SUB81(uVar97 >> 7,0);
        auVar139._28_4_ = (uint)bVar13 * auVar133._28_4_ | (uint)!bVar13 * auVar116._28_4_;
        auVar140._0_4_ =
             (uint)(bVar96 & 1) * (int)auVar113._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar117._0_4_;
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar13 * (int)auVar113._4_4_ | (uint)!bVar13 * auVar117._4_4_;
        bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar13 * (int)auVar113._8_4_ | (uint)!bVar13 * auVar117._8_4_;
        bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar13 * (int)auVar113._12_4_ | (uint)!bVar13 * auVar117._12_4_;
        auVar140._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar117._16_4_;
        auVar140._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar117._20_4_;
        auVar140._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar117._24_4_;
        auVar140._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar117._28_4_;
        bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar141._0_4_ =
             (uint)(bVar96 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar28._0_4_;
        bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar14 * auVar129._4_4_ | (uint)!bVar14 * auVar28._4_4_;
        bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar14 * auVar129._8_4_ | (uint)!bVar14 * auVar28._8_4_;
        bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar14 * auVar129._12_4_ | (uint)!bVar14 * auVar28._12_4_;
        auVar141._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar129._16_4_;
        auVar141._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar129._20_4_;
        auVar141._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar129._24_4_;
        iVar2 = (uint)(byte)(uVar97 >> 7) * auVar129._28_4_;
        auVar141._28_4_ = iVar2;
        auVar119 = vsubps_avx512vl(auVar140,auVar127);
        auVar133 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar114._12_4_ |
                                                 (uint)!bVar16 * auVar112._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar114._8_4_ |
                                                          (uint)!bVar15 * auVar112._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar114._4_4_ |
                                                                   (uint)!bVar13 * auVar112._4_4_,
                                                                   (uint)(bVar96 & 1) *
                                                                   (int)auVar114._0_4_ |
                                                                   (uint)!(bool)(bVar96 & 1) *
                                                                   auVar112._0_4_)))),auVar118);
        auVar129 = vsubps_avx(auVar141,auVar130);
        auVar128 = vsubps_avx(auVar127,auVar137);
        auVar116 = vsubps_avx(auVar118,auVar138);
        auVar117 = vsubps_avx(auVar130,auVar139);
        auVar122._4_4_ = auVar129._4_4_ * fVar157;
        auVar122._0_4_ = auVar129._0_4_ * fVar105;
        auVar122._8_4_ = auVar129._8_4_ * fVar159;
        auVar122._12_4_ = auVar129._12_4_ * fVar161;
        auVar122._16_4_ = auVar129._16_4_ * 0.0;
        auVar122._20_4_ = auVar129._20_4_ * 0.0;
        auVar122._24_4_ = auVar129._24_4_ * 0.0;
        auVar122._28_4_ = iVar2;
        auVar111 = vfmsub231ps_fma(auVar122,auVar130,auVar119);
        auVar123._4_4_ = fVar158 * auVar119._4_4_;
        auVar123._0_4_ = fVar106 * auVar119._0_4_;
        auVar123._8_4_ = fVar160 * auVar119._8_4_;
        auVar123._12_4_ = fVar162 * auVar119._12_4_;
        auVar123._16_4_ = auVar119._16_4_ * 0.0;
        auVar123._20_4_ = auVar119._20_4_ * 0.0;
        auVar123._24_4_ = auVar119._24_4_ * 0.0;
        auVar123._28_4_ = auVar131._28_4_;
        auVar110 = vfmsub231ps_fma(auVar123,auVar127,auVar133);
        auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar132,ZEXT1632(auVar111));
        auVar207._0_4_ = auVar133._0_4_ * auVar130._0_4_;
        auVar207._4_4_ = auVar133._4_4_ * auVar130._4_4_;
        auVar207._8_4_ = auVar133._8_4_ * auVar130._8_4_;
        auVar207._12_4_ = auVar133._12_4_ * auVar130._12_4_;
        auVar207._16_4_ = auVar133._16_4_ * fVar211;
        auVar207._20_4_ = auVar133._20_4_ * fVar203;
        auVar207._24_4_ = auVar133._24_4_ * fVar213;
        auVar207._28_4_ = 0;
        auVar111 = vfmsub231ps_fma(auVar207,auVar118,auVar129);
        auVar120 = vfmadd231ps_avx512vl(auVar131,auVar132,ZEXT1632(auVar111));
        auVar131 = vmulps_avx512vl(auVar117,auVar137);
        auVar131 = vfmsub231ps_avx512vl(auVar131,auVar128,auVar139);
        auVar126._4_4_ = auVar116._4_4_ * auVar139._4_4_;
        auVar126._0_4_ = auVar116._0_4_ * auVar139._0_4_;
        auVar126._8_4_ = auVar116._8_4_ * auVar139._8_4_;
        auVar126._12_4_ = auVar116._12_4_ * auVar139._12_4_;
        auVar126._16_4_ = auVar116._16_4_ * auVar139._16_4_;
        auVar126._20_4_ = auVar116._20_4_ * auVar139._20_4_;
        auVar126._24_4_ = auVar116._24_4_ * auVar139._24_4_;
        auVar126._28_4_ = auVar139._28_4_;
        auVar111 = vfmsub231ps_fma(auVar126,auVar138,auVar117);
        auVar208._0_4_ = auVar138._0_4_ * auVar128._0_4_;
        auVar208._4_4_ = auVar138._4_4_ * auVar128._4_4_;
        auVar208._8_4_ = auVar138._8_4_ * auVar128._8_4_;
        auVar208._12_4_ = auVar138._12_4_ * auVar128._12_4_;
        auVar208._16_4_ = fVar214 * auVar128._16_4_;
        auVar208._20_4_ = fVar194 * auVar128._20_4_;
        auVar208._24_4_ = fVar202 * auVar128._24_4_;
        auVar208._28_4_ = 0;
        auVar110 = vfmsub231ps_fma(auVar208,auVar116,auVar137);
        auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar132,auVar131);
        auVar122 = vfmadd231ps_avx512vl(auVar131,auVar132,ZEXT1632(auVar111));
        auVar131 = vmaxps_avx(auVar120,auVar122);
        uVar165 = vcmpps_avx512vl(auVar131,auVar132,2);
        bVar104 = bVar104 & (byte)uVar165;
        auVar243 = ZEXT3264(local_720);
        auVar244 = ZEXT3264(local_700);
        auVar245 = ZEXT3264(local_740);
        auVar242 = ZEXT3264(local_900);
        auVar238 = ZEXT1664(_local_8e0);
        if (bVar104 == 0) {
          bVar104 = 0;
        }
        else {
          auVar51._4_4_ = auVar117._4_4_ * auVar133._4_4_;
          auVar51._0_4_ = auVar117._0_4_ * auVar133._0_4_;
          auVar51._8_4_ = auVar117._8_4_ * auVar133._8_4_;
          auVar51._12_4_ = auVar117._12_4_ * auVar133._12_4_;
          auVar51._16_4_ = auVar117._16_4_ * auVar133._16_4_;
          auVar51._20_4_ = auVar117._20_4_ * auVar133._20_4_;
          auVar51._24_4_ = auVar117._24_4_ * auVar133._24_4_;
          auVar51._28_4_ = auVar131._28_4_;
          auVar112 = vfmsub231ps_fma(auVar51,auVar116,auVar129);
          auVar52._4_4_ = auVar129._4_4_ * auVar128._4_4_;
          auVar52._0_4_ = auVar129._0_4_ * auVar128._0_4_;
          auVar52._8_4_ = auVar129._8_4_ * auVar128._8_4_;
          auVar52._12_4_ = auVar129._12_4_ * auVar128._12_4_;
          auVar52._16_4_ = auVar129._16_4_ * auVar128._16_4_;
          auVar52._20_4_ = auVar129._20_4_ * auVar128._20_4_;
          auVar52._24_4_ = auVar129._24_4_ * auVar128._24_4_;
          auVar52._28_4_ = auVar129._28_4_;
          auVar110 = vfmsub231ps_fma(auVar52,auVar119,auVar117);
          auVar53._4_4_ = auVar116._4_4_ * auVar119._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * auVar119._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * auVar119._8_4_;
          auVar53._12_4_ = auVar116._12_4_ * auVar119._12_4_;
          auVar53._16_4_ = auVar116._16_4_ * auVar119._16_4_;
          auVar53._20_4_ = auVar116._20_4_ * auVar119._20_4_;
          auVar53._24_4_ = auVar116._24_4_ * auVar119._24_4_;
          auVar53._28_4_ = auVar116._28_4_;
          auVar28 = vfmsub231ps_fma(auVar53,auVar128,auVar133);
          auVar111 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar110),ZEXT1632(auVar28));
          auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar112),auVar132);
          auVar133 = vrcp14ps_avx512vl(auVar131);
          auVar42._8_4_ = 0x3f800000;
          auVar42._0_8_ = &DAT_3f8000003f800000;
          auVar42._12_4_ = 0x3f800000;
          auVar42._16_4_ = 0x3f800000;
          auVar42._20_4_ = 0x3f800000;
          auVar42._24_4_ = 0x3f800000;
          auVar42._28_4_ = 0x3f800000;
          auVar129 = vfnmadd213ps_avx512vl(auVar133,auVar131,auVar42);
          auVar111 = vfmadd132ps_fma(auVar129,auVar133,auVar133);
          auVar54._4_4_ = auVar28._4_4_ * auVar130._4_4_;
          auVar54._0_4_ = auVar28._0_4_ * auVar130._0_4_;
          auVar54._8_4_ = auVar28._8_4_ * auVar130._8_4_;
          auVar54._12_4_ = auVar28._12_4_ * auVar130._12_4_;
          auVar54._16_4_ = fVar211 * 0.0;
          auVar54._20_4_ = fVar203 * 0.0;
          auVar54._24_4_ = fVar213 * 0.0;
          auVar54._28_4_ = iVar1;
          auVar110 = vfmadd231ps_fma(auVar54,auVar118,ZEXT1632(auVar110));
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar127,ZEXT1632(auVar112));
          fVar203 = auVar111._0_4_;
          fVar211 = auVar111._4_4_;
          fVar213 = auVar111._8_4_;
          fVar214 = auVar111._12_4_;
          auVar133 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar214,
                                        CONCAT48(auVar110._8_4_ * fVar213,
                                                 CONCAT44(auVar110._4_4_ * fVar211,
                                                          auVar110._0_4_ * fVar203))));
          auVar228._4_4_ = fVar204;
          auVar228._0_4_ = fVar204;
          auVar228._8_4_ = fVar204;
          auVar228._12_4_ = fVar204;
          auVar228._16_4_ = fVar204;
          auVar228._20_4_ = fVar204;
          auVar228._24_4_ = fVar204;
          auVar228._28_4_ = fVar204;
          uVar165 = vcmpps_avx512vl(auVar228,auVar133,2);
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar43._4_4_ = uVar164;
          auVar43._0_4_ = uVar164;
          auVar43._8_4_ = uVar164;
          auVar43._12_4_ = uVar164;
          auVar43._16_4_ = uVar164;
          auVar43._20_4_ = uVar164;
          auVar43._24_4_ = uVar164;
          auVar43._28_4_ = uVar164;
          uVar34 = vcmpps_avx512vl(auVar133,auVar43,2);
          bVar104 = (byte)uVar165 & (byte)uVar34 & bVar104;
          if (bVar104 != 0) {
            uVar165 = vcmpps_avx512vl(auVar131,auVar132,4);
            if ((bVar104 & (byte)uVar165) != 0) {
              bVar104 = bVar104 & (byte)uVar165;
              fVar194 = auVar120._0_4_ * fVar203;
              fVar202 = auVar120._4_4_ * fVar211;
              auVar55._4_4_ = fVar202;
              auVar55._0_4_ = fVar194;
              fVar105 = auVar120._8_4_ * fVar213;
              auVar55._8_4_ = fVar105;
              fVar106 = auVar120._12_4_ * fVar214;
              auVar55._12_4_ = fVar106;
              fVar157 = auVar120._16_4_ * 0.0;
              auVar55._16_4_ = fVar157;
              fVar158 = auVar120._20_4_ * 0.0;
              auVar55._20_4_ = fVar158;
              fVar159 = auVar120._24_4_ * 0.0;
              auVar55._24_4_ = fVar159;
              auVar55._28_4_ = auVar120._28_4_;
              fVar203 = auVar122._0_4_ * fVar203;
              fVar211 = auVar122._4_4_ * fVar211;
              auVar56._4_4_ = fVar211;
              auVar56._0_4_ = fVar203;
              fVar213 = auVar122._8_4_ * fVar213;
              auVar56._8_4_ = fVar213;
              fVar214 = auVar122._12_4_ * fVar214;
              auVar56._12_4_ = fVar214;
              fVar160 = auVar122._16_4_ * 0.0;
              auVar56._16_4_ = fVar160;
              fVar161 = auVar122._20_4_ * 0.0;
              auVar56._20_4_ = fVar161;
              fVar162 = auVar122._24_4_ * 0.0;
              auVar56._24_4_ = fVar162;
              auVar56._28_4_ = auVar122._28_4_;
              auVar222._8_4_ = 0x3f800000;
              auVar222._0_8_ = &DAT_3f8000003f800000;
              auVar222._12_4_ = 0x3f800000;
              auVar222._16_4_ = 0x3f800000;
              auVar222._20_4_ = 0x3f800000;
              auVar222._24_4_ = 0x3f800000;
              auVar222._28_4_ = 0x3f800000;
              auVar131 = vsubps_avx(auVar222,auVar55);
              local_840._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar194 | (uint)!(bool)(bVar96 & 1) * auVar131._0_4_;
              bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
              local_840._4_4_ = (uint)bVar13 * (int)fVar202 | (uint)!bVar13 * auVar131._4_4_;
              bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
              local_840._8_4_ = (uint)bVar13 * (int)fVar105 | (uint)!bVar13 * auVar131._8_4_;
              bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
              local_840._12_4_ = (uint)bVar13 * (int)fVar106 | (uint)!bVar13 * auVar131._12_4_;
              bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
              local_840._16_4_ = (uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar131._16_4_;
              bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
              local_840._20_4_ = (uint)bVar13 * (int)fVar158 | (uint)!bVar13 * auVar131._20_4_;
              bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
              local_840._24_4_ = (uint)bVar13 * (int)fVar159 | (uint)!bVar13 * auVar131._24_4_;
              bVar13 = SUB81(uVar97 >> 7,0);
              local_840._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar131._28_4_;
              auVar131 = vsubps_avx(auVar222,auVar56);
              local_520._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar203 | (uint)!(bool)(bVar96 & 1) * auVar131._0_4_;
              bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
              local_520._4_4_ = (uint)bVar13 * (int)fVar211 | (uint)!bVar13 * auVar131._4_4_;
              bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
              local_520._8_4_ = (uint)bVar13 * (int)fVar213 | (uint)!bVar13 * auVar131._8_4_;
              bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
              local_520._12_4_ = (uint)bVar13 * (int)fVar214 | (uint)!bVar13 * auVar131._12_4_;
              bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
              local_520._16_4_ = (uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar131._16_4_;
              bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
              local_520._20_4_ = (uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar131._20_4_;
              bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
              local_520._24_4_ = (uint)bVar13 * (int)fVar162 | (uint)!bVar13 * auVar131._24_4_;
              bVar13 = SUB81(uVar97 >> 7,0);
              local_520._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar131._28_4_;
              local_860 = auVar133;
              goto LAB_01c17af5;
            }
          }
          bVar104 = 0;
        }
LAB_01c17af5:
        auVar248 = ZEXT3264(local_820);
        auVar180 = ZEXT3264(local_800);
        auVar247 = ZEXT3264(local_7e0);
        auVar250 = ZEXT3264(auVar121);
        if (bVar104 != 0) {
          auVar131 = vsubps_avx(ZEXT1632(auVar33),auVar124);
          auVar111 = vfmadd213ps_fma(auVar131,local_840,auVar124);
          uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar124._4_4_ = uVar164;
          auVar124._0_4_ = uVar164;
          auVar124._8_4_ = uVar164;
          auVar124._12_4_ = uVar164;
          auVar124._16_4_ = uVar164;
          auVar124._20_4_ = uVar164;
          auVar124._24_4_ = uVar164;
          auVar124._28_4_ = uVar164;
          auVar131 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar111._12_4_ + auVar111._12_4_,
                                                        CONCAT48(auVar111._8_4_ + auVar111._8_4_,
                                                                 CONCAT44(auVar111._4_4_ +
                                                                          auVar111._4_4_,
                                                                          auVar111._0_4_ +
                                                                          auVar111._0_4_)))),
                                     auVar124);
          uVar165 = vcmpps_avx512vl(local_860,auVar131,6);
          bVar104 = bVar104 & (byte)uVar165;
          if (bVar104 != 0) {
            auVar174._8_4_ = 0xbf800000;
            auVar174._0_8_ = 0xbf800000bf800000;
            auVar174._12_4_ = 0xbf800000;
            auVar174._16_4_ = 0xbf800000;
            auVar174._20_4_ = 0xbf800000;
            auVar174._24_4_ = 0xbf800000;
            auVar174._28_4_ = 0xbf800000;
            auVar44._8_4_ = 0x40000000;
            auVar44._0_8_ = 0x4000000040000000;
            auVar44._12_4_ = 0x40000000;
            auVar44._16_4_ = 0x40000000;
            auVar44._20_4_ = 0x40000000;
            auVar44._24_4_ = 0x40000000;
            auVar44._28_4_ = 0x40000000;
            local_680 = vfmadd132ps_avx512vl(local_520,auVar174,auVar44);
            local_520 = local_680;
            auVar131 = local_520;
            local_640 = 0;
            local_630 = local_970;
            uStack_628 = uStack_968;
            local_620 = local_8b0._0_8_;
            uStack_618 = local_8b0._8_8_;
            local_610 = local_8c0._0_8_;
            uStack_608 = local_8c0._8_8_;
            local_600 = local_8d0;
            uStack_5f8 = uStack_8c8;
            local_520 = auVar131;
            if ((pGVar101->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar203 = 1.0 / auVar125._0_4_;
              local_5e0[0] = fVar203 * (local_840._0_4_ + 0.0);
              local_5e0[1] = fVar203 * (local_840._4_4_ + 1.0);
              local_5e0[2] = fVar203 * (local_840._8_4_ + 2.0);
              local_5e0[3] = fVar203 * (local_840._12_4_ + 3.0);
              fStack_5d0 = fVar203 * (local_840._16_4_ + 4.0);
              fStack_5cc = fVar203 * (local_840._20_4_ + 5.0);
              fStack_5c8 = fVar203 * (local_840._24_4_ + 6.0);
              fStack_5c4 = local_840._28_4_ + 7.0;
              local_520._0_8_ = local_680._0_8_;
              local_520._8_8_ = local_680._8_8_;
              local_520._16_8_ = local_680._16_8_;
              local_520._24_8_ = local_680._24_8_;
              local_5c0 = local_520._0_8_;
              uStack_5b8 = local_520._8_8_;
              uStack_5b0 = local_520._16_8_;
              uStack_5a8 = local_520._24_8_;
              local_5a0 = local_860;
              auVar175._8_4_ = 0x7f800000;
              auVar175._0_8_ = 0x7f8000007f800000;
              auVar175._12_4_ = 0x7f800000;
              auVar175._16_4_ = 0x7f800000;
              auVar175._20_4_ = 0x7f800000;
              auVar175._24_4_ = 0x7f800000;
              auVar175._28_4_ = 0x7f800000;
              auVar131 = vblendmps_avx512vl(auVar175,local_860);
              auVar142._0_4_ =
                   (uint)(bVar104 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar104 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 1 & 1);
              auVar142._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 2 & 1);
              auVar142._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 3 & 1);
              auVar142._12_4_ = (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 4 & 1);
              auVar142._16_4_ = (uint)bVar13 * auVar131._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 5 & 1);
              auVar142._20_4_ = (uint)bVar13 * auVar131._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar104 >> 6 & 1);
              auVar142._24_4_ = (uint)bVar13 * auVar131._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar142._28_4_ =
                   (uint)(bVar104 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar104 >> 7) * 0x7f800000
              ;
              auVar131 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar131 = vminps_avx(auVar142,auVar131);
              auVar133 = vshufpd_avx(auVar131,auVar131,5);
              auVar131 = vminps_avx(auVar131,auVar133);
              auVar133 = vpermpd_avx2(auVar131,0x4e);
              auVar131 = vminps_avx(auVar131,auVar133);
              uVar165 = vcmpps_avx512vl(auVar142,auVar131,0);
              bVar95 = (byte)uVar165 & bVar104;
              bVar96 = bVar104;
              if (bVar95 != 0) {
                bVar96 = bVar95;
              }
              uVar36 = 0;
              for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                uVar36 = uVar36 + 1;
              }
              uVar97 = (ulong)uVar36;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar203 = local_5e0[uVar97];
                uVar164 = *(undefined4 *)((long)&local_5c0 + uVar97 * 4);
                fVar213 = 1.0 - fVar203;
                fVar211 = fVar213 * fVar213 * -3.0;
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                           ZEXT416((uint)(fVar203 * fVar213)),ZEXT416(0xc0000000));
                auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar203 * fVar213)),
                                           ZEXT416((uint)(fVar203 * fVar203)),ZEXT416(0x40000000));
                fVar213 = auVar111._0_4_ * 3.0;
                fVar214 = auVar110._0_4_ * 3.0;
                fVar194 = fVar203 * fVar203 * 3.0;
                auVar218._0_4_ = fVar194 * (float)local_8d0._0_4_;
                auVar218._4_4_ = fVar194 * (float)local_8d0._4_4_;
                auVar218._8_4_ = fVar194 * (float)uStack_8c8;
                auVar218._12_4_ = fVar194 * uStack_8c8._4_4_;
                auVar190._4_4_ = fVar214;
                auVar190._0_4_ = fVar214;
                auVar190._8_4_ = fVar214;
                auVar190._12_4_ = fVar214;
                auVar111 = vfmadd132ps_fma(auVar190,auVar218,local_8c0);
                auVar197._4_4_ = fVar213;
                auVar197._0_4_ = fVar213;
                auVar197._8_4_ = fVar213;
                auVar197._12_4_ = fVar213;
                auVar111 = vfmadd132ps_fma(auVar197,auVar111,local_8b0);
                auVar191._4_4_ = fVar211;
                auVar191._0_4_ = fVar211;
                auVar191._8_4_ = fVar211;
                auVar191._12_4_ = fVar211;
                auVar111 = vfmadd132ps_fma(auVar191,auVar111,auVar27);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar111._0_4_;
                uVar9 = vextractps_avx(auVar111,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                uVar9 = vextractps_avx(auVar111,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                *(float *)(ray + k * 4 + 0x3c0) = fVar203;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar164;
                *(uint *)(ray + k * 4 + 0x440) = uVar7;
                *(uint *)(ray + k * 4 + 0x480) = uVar102;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar155 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar155);
                auVar155 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar155);
                local_7a0 = local_8b0._0_4_;
                uStack_79c = local_8b0._4_4_;
                uStack_798 = local_8b0._8_8_;
                local_7b0 = local_8c0._0_8_;
                uStack_7a8 = local_8c0._8_8_;
                local_7c0 = (float)local_8d0._0_4_;
                fStack_7bc = (float)local_8d0._4_4_;
                fStack_7b8 = (float)uStack_8c8;
                fStack_7b4 = uStack_8c8._4_4_;
                local_780 = fVar204;
                local_760 = auVar121;
                local_6a0 = local_840;
                local_660 = local_860;
                local_63c = iVar8;
                local_5f0 = bVar104;
                do {
                  auVar112 = auVar246._0_16_;
                  local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar97]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_5c0 + uVar97 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                  local_960.context = context->user;
                  fVar213 = local_200._0_4_;
                  fVar203 = 1.0 - fVar213;
                  fVar212 = fVar203 * fVar203 * -3.0;
                  auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                             ZEXT416((uint)(fVar213 * fVar203)),ZEXT416(0xc0000000))
                  ;
                  auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar213 * fVar203)),
                                             ZEXT416((uint)(fVar213 * fVar213)),ZEXT416(0x40000000))
                  ;
                  fVar203 = auVar111._0_4_ * 3.0;
                  fVar211 = auVar110._0_4_ * 3.0;
                  fVar213 = fVar213 * fVar213 * 3.0;
                  auVar221._0_4_ = fVar213 * local_7c0;
                  auVar221._4_4_ = fVar213 * fStack_7bc;
                  auVar221._8_4_ = fVar213 * fStack_7b8;
                  auVar221._12_4_ = fVar213 * fStack_7b4;
                  auVar172._4_4_ = fVar211;
                  auVar172._0_4_ = fVar211;
                  auVar172._8_4_ = fVar211;
                  auVar172._12_4_ = fVar211;
                  auVar91._8_8_ = uStack_7a8;
                  auVar91._0_8_ = local_7b0;
                  auVar111 = vfmadd132ps_fma(auVar172,auVar221,auVar91);
                  auVar200._4_4_ = fVar203;
                  auVar200._0_4_ = fVar203;
                  auVar200._8_4_ = fVar203;
                  auVar200._12_4_ = fVar203;
                  auVar92._4_4_ = uStack_79c;
                  auVar92._0_4_ = local_7a0;
                  auVar92._8_8_ = uStack_798;
                  auVar111 = vfmadd132ps_fma(auVar200,auVar111,auVar92);
                  auVar173._4_4_ = fVar212;
                  auVar173._0_4_ = fVar212;
                  auVar173._8_4_ = fVar212;
                  auVar173._12_4_ = fVar212;
                  auVar111 = vfmadd132ps_fma(auVar173,auVar111,auVar27);
                  auVar155 = vbroadcastss_avx512f(auVar111);
                  auVar156 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar156,ZEXT1664(auVar111));
                  auVar156 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar156,ZEXT1664(auVar111));
                  local_2c0[0] = (RTCHitN)auVar155[0];
                  local_2c0[1] = (RTCHitN)auVar155[1];
                  local_2c0[2] = (RTCHitN)auVar155[2];
                  local_2c0[3] = (RTCHitN)auVar155[3];
                  local_2c0[4] = (RTCHitN)auVar155[4];
                  local_2c0[5] = (RTCHitN)auVar155[5];
                  local_2c0[6] = (RTCHitN)auVar155[6];
                  local_2c0[7] = (RTCHitN)auVar155[7];
                  local_2c0[8] = (RTCHitN)auVar155[8];
                  local_2c0[9] = (RTCHitN)auVar155[9];
                  local_2c0[10] = (RTCHitN)auVar155[10];
                  local_2c0[0xb] = (RTCHitN)auVar155[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar155[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar155[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar155[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar155[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar155[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar155[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar155[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar155[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar155[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar155[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar155[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar155[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar155[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar155[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar155[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar155[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar155[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar155[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar155[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar155[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar155[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar155[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar155[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar155[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar155[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar155[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar155[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar155[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar155[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar155[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar155[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar155[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar155[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar155[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar155[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar155[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar155[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar155[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar155[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar155[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar155[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar155[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar155[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar155[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar155[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar155[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar155[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar155[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar155[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar155[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar155[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar155[0x3f];
                  local_180 = local_4c0._0_8_;
                  uStack_178 = local_4c0._8_8_;
                  uStack_170 = local_4c0._16_8_;
                  uStack_168 = local_4c0._24_8_;
                  uStack_160 = local_4c0._32_8_;
                  uStack_158 = local_4c0._40_8_;
                  uStack_150 = local_4c0._48_8_;
                  uStack_148 = local_4c0._56_8_;
                  auVar155 = vmovdqa64_avx512f(local_480);
                  local_140 = vmovdqa64_avx512f(auVar155);
                  auVar131 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                  local_928[3] = auVar131;
                  local_928[2] = auVar131;
                  local_928[1] = auVar131;
                  *local_928 = auVar131;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instPrimID[0]));
                  local_580 = local_300;
                  local_960.valid = (int *)local_580;
                  local_960.geometryUserPtr = pGVar101->userPtr;
                  local_960.hit = local_2c0;
                  local_960.N = 0x10;
                  local_6e0 = (undefined4)uVar97;
                  uStack_6dc = (undefined4)(uVar97 >> 0x20);
                  local_960.ray = (RTCRayN *)ray;
                  if (pGVar101->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar101->intersectionFilterN)(&local_960);
                    uVar97 = CONCAT44(uStack_6dc,local_6e0);
                    auVar238 = ZEXT1664(_local_8e0);
                    auVar250 = ZEXT3264(local_760);
                    auVar248 = ZEXT3264(local_820);
                    auVar180 = ZEXT3264(local_800);
                    auVar247 = ZEXT3264(local_7e0);
                    auVar249 = ZEXT3264(local_920);
                    auVar242 = ZEXT3264(local_900);
                    auVar245 = ZEXT3264(local_740);
                    auVar244 = ZEXT3264(local_700);
                    auVar243 = ZEXT3264(local_720);
                    auVar111 = vxorps_avx512vl(auVar112,auVar112);
                    auVar246 = ZEXT1664(auVar111);
                    fVar204 = local_780;
                  }
                  auVar111 = auVar246._0_16_;
                  auVar155 = vmovdqa64_avx512f(local_580);
                  uVar165 = vptestmd_avx512f(auVar155,auVar155);
                  if ((short)uVar165 == 0) {
LAB_01c1918d:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_440._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar101->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_960);
                      uVar97 = CONCAT44(uStack_6dc,local_6e0);
                      auVar238 = ZEXT1664(_local_8e0);
                      auVar250 = ZEXT3264(local_760);
                      auVar248 = ZEXT3264(local_820);
                      auVar180 = ZEXT3264(local_800);
                      auVar247 = ZEXT3264(local_7e0);
                      auVar249 = ZEXT3264(local_920);
                      auVar242 = ZEXT3264(local_900);
                      auVar245 = ZEXT3264(local_740);
                      auVar244 = ZEXT3264(local_700);
                      auVar243 = ZEXT3264(local_720);
                      auVar111 = vxorps_avx512vl(auVar111,auVar111);
                      auVar246 = ZEXT1664(auVar111);
                      fVar204 = local_780;
                    }
                    auVar155 = vmovdqa64_avx512f(local_580);
                    uVar35 = vptestmd_avx512f(auVar155,auVar155);
                    if ((short)uVar35 == 0) goto LAB_01c1918d;
                    iVar1 = *(int *)(local_960.hit + 4);
                    iVar2 = *(int *)(local_960.hit + 8);
                    iVar76 = *(int *)(local_960.hit + 0xc);
                    iVar77 = *(int *)(local_960.hit + 0x10);
                    iVar78 = *(int *)(local_960.hit + 0x14);
                    iVar79 = *(int *)(local_960.hit + 0x18);
                    iVar80 = *(int *)(local_960.hit + 0x1c);
                    iVar81 = *(int *)(local_960.hit + 0x20);
                    iVar82 = *(int *)(local_960.hit + 0x24);
                    iVar83 = *(int *)(local_960.hit + 0x28);
                    iVar84 = *(int *)(local_960.hit + 0x2c);
                    iVar85 = *(int *)(local_960.hit + 0x30);
                    iVar86 = *(int *)(local_960.hit + 0x34);
                    iVar87 = *(int *)(local_960.hit + 0x38);
                    iVar88 = *(int *)(local_960.hit + 0x3c);
                    bVar96 = (byte)uVar35;
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar95 = (byte)(uVar35 >> 8);
                    bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar26 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x300) =
                         (uint)(bVar96 & 1) * *(int *)local_960.hit |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x300);
                    *(uint *)(local_960.ray + 0x304) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x304);
                    *(uint *)(local_960.ray + 0x308) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x308);
                    *(uint *)(local_960.ray + 0x30c) =
                         (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x30c);
                    *(uint *)(local_960.ray + 0x310) =
                         (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x310);
                    *(uint *)(local_960.ray + 0x314) =
                         (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x314);
                    *(uint *)(local_960.ray + 0x318) =
                         (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x318);
                    *(uint *)(local_960.ray + 0x31c) =
                         (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x31c);
                    *(uint *)(local_960.ray + 800) =
                         (uint)(bVar95 & 1) * iVar81 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 800);
                    *(uint *)(local_960.ray + 0x324) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x324);
                    *(uint *)(local_960.ray + 0x328) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x328);
                    *(uint *)(local_960.ray + 0x32c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x32c);
                    *(uint *)(local_960.ray + 0x330) =
                         (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x330);
                    *(uint *)(local_960.ray + 0x334) =
                         (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x334);
                    *(uint *)(local_960.ray + 0x338) =
                         (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x338);
                    *(uint *)(local_960.ray + 0x33c) =
                         (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x33c);
                    iVar1 = *(int *)(local_960.hit + 0x44);
                    iVar2 = *(int *)(local_960.hit + 0x48);
                    iVar76 = *(int *)(local_960.hit + 0x4c);
                    iVar77 = *(int *)(local_960.hit + 0x50);
                    iVar78 = *(int *)(local_960.hit + 0x54);
                    iVar79 = *(int *)(local_960.hit + 0x58);
                    iVar80 = *(int *)(local_960.hit + 0x5c);
                    iVar81 = *(int *)(local_960.hit + 0x60);
                    iVar82 = *(int *)(local_960.hit + 100);
                    iVar83 = *(int *)(local_960.hit + 0x68);
                    iVar84 = *(int *)(local_960.hit + 0x6c);
                    iVar85 = *(int *)(local_960.hit + 0x70);
                    iVar86 = *(int *)(local_960.hit + 0x74);
                    iVar87 = *(int *)(local_960.hit + 0x78);
                    iVar88 = *(int *)(local_960.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar26 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x340) =
                         (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x40) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x340);
                    *(uint *)(local_960.ray + 0x344) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x344);
                    *(uint *)(local_960.ray + 0x348) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x348);
                    *(uint *)(local_960.ray + 0x34c) =
                         (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x34c);
                    *(uint *)(local_960.ray + 0x350) =
                         (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x350);
                    *(uint *)(local_960.ray + 0x354) =
                         (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x354);
                    *(uint *)(local_960.ray + 0x358) =
                         (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x358);
                    *(uint *)(local_960.ray + 0x35c) =
                         (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x35c);
                    *(uint *)(local_960.ray + 0x360) =
                         (uint)(bVar95 & 1) * iVar81 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x360);
                    *(uint *)(local_960.ray + 0x364) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x364);
                    *(uint *)(local_960.ray + 0x368) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x368);
                    *(uint *)(local_960.ray + 0x36c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x36c);
                    *(uint *)(local_960.ray + 0x370) =
                         (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x370);
                    *(uint *)(local_960.ray + 0x374) =
                         (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x374);
                    *(uint *)(local_960.ray + 0x378) =
                         (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x378);
                    *(uint *)(local_960.ray + 0x37c) =
                         (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x37c);
                    iVar1 = *(int *)(local_960.hit + 0x84);
                    iVar2 = *(int *)(local_960.hit + 0x88);
                    iVar76 = *(int *)(local_960.hit + 0x8c);
                    iVar77 = *(int *)(local_960.hit + 0x90);
                    iVar78 = *(int *)(local_960.hit + 0x94);
                    iVar79 = *(int *)(local_960.hit + 0x98);
                    iVar80 = *(int *)(local_960.hit + 0x9c);
                    iVar81 = *(int *)(local_960.hit + 0xa0);
                    iVar82 = *(int *)(local_960.hit + 0xa4);
                    iVar83 = *(int *)(local_960.hit + 0xa8);
                    iVar84 = *(int *)(local_960.hit + 0xac);
                    iVar85 = *(int *)(local_960.hit + 0xb0);
                    iVar86 = *(int *)(local_960.hit + 0xb4);
                    iVar87 = *(int *)(local_960.hit + 0xb8);
                    iVar88 = *(int *)(local_960.hit + 0xbc);
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar26 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x380) =
                         (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x80) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x380);
                    *(uint *)(local_960.ray + 900) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 900);
                    *(uint *)(local_960.ray + 0x388) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x388);
                    *(uint *)(local_960.ray + 0x38c) =
                         (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x38c);
                    *(uint *)(local_960.ray + 0x390) =
                         (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x390);
                    *(uint *)(local_960.ray + 0x394) =
                         (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x394);
                    *(uint *)(local_960.ray + 0x398) =
                         (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x398);
                    *(uint *)(local_960.ray + 0x39c) =
                         (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x39c);
                    *(uint *)(local_960.ray + 0x3a0) =
                         (uint)(bVar95 & 1) * iVar81 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x3a0);
                    *(uint *)(local_960.ray + 0x3a4) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3a4);
                    *(uint *)(local_960.ray + 0x3a8) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x3a8);
                    *(uint *)(local_960.ray + 0x3ac) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ac);
                    *(uint *)(local_960.ray + 0x3b0) =
                         (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3b0);
                    *(uint *)(local_960.ray + 0x3b4) =
                         (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3b4);
                    *(uint *)(local_960.ray + 0x3b8) =
                         (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3b8);
                    *(uint *)(local_960.ray + 0x3bc) =
                         (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3bc);
                    iVar1 = *(int *)(local_960.hit + 0xc4);
                    iVar2 = *(int *)(local_960.hit + 200);
                    iVar76 = *(int *)(local_960.hit + 0xcc);
                    iVar77 = *(int *)(local_960.hit + 0xd0);
                    iVar78 = *(int *)(local_960.hit + 0xd4);
                    iVar79 = *(int *)(local_960.hit + 0xd8);
                    iVar80 = *(int *)(local_960.hit + 0xdc);
                    iVar81 = *(int *)(local_960.hit + 0xe0);
                    iVar82 = *(int *)(local_960.hit + 0xe4);
                    iVar83 = *(int *)(local_960.hit + 0xe8);
                    iVar84 = *(int *)(local_960.hit + 0xec);
                    iVar85 = *(int *)(local_960.hit + 0xf0);
                    iVar86 = *(int *)(local_960.hit + 0xf4);
                    iVar87 = *(int *)(local_960.hit + 0xf8);
                    iVar88 = *(int *)(local_960.hit + 0xfc);
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar26 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x3c0) =
                         (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0xc0) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x3c0);
                    *(uint *)(local_960.ray + 0x3c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x3c4);
                    *(uint *)(local_960.ray + 0x3c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x3c8);
                    *(uint *)(local_960.ray + 0x3cc) =
                         (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x3cc);
                    *(uint *)(local_960.ray + 0x3d0) =
                         (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x3d0);
                    *(uint *)(local_960.ray + 0x3d4) =
                         (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x3d4);
                    *(uint *)(local_960.ray + 0x3d8) =
                         (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x3d8);
                    *(uint *)(local_960.ray + 0x3dc) =
                         (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x3dc);
                    *(uint *)(local_960.ray + 0x3e0) =
                         (uint)(bVar95 & 1) * iVar81 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x3e0);
                    *(uint *)(local_960.ray + 0x3e4) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3e4);
                    *(uint *)(local_960.ray + 1000) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 1000);
                    *(uint *)(local_960.ray + 0x3ec) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ec);
                    *(uint *)(local_960.ray + 0x3f0) =
                         (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3f0);
                    *(uint *)(local_960.ray + 0x3f4) =
                         (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3f4);
                    *(uint *)(local_960.ray + 0x3f8) =
                         (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3f8);
                    *(uint *)(local_960.ray + 0x3fc) =
                         (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3fc);
                    iVar1 = *(int *)(local_960.hit + 0x104);
                    iVar2 = *(int *)(local_960.hit + 0x108);
                    iVar76 = *(int *)(local_960.hit + 0x10c);
                    iVar77 = *(int *)(local_960.hit + 0x110);
                    iVar78 = *(int *)(local_960.hit + 0x114);
                    iVar79 = *(int *)(local_960.hit + 0x118);
                    iVar80 = *(int *)(local_960.hit + 0x11c);
                    iVar81 = *(int *)(local_960.hit + 0x120);
                    iVar82 = *(int *)(local_960.hit + 0x124);
                    iVar83 = *(int *)(local_960.hit + 0x128);
                    iVar84 = *(int *)(local_960.hit + 300);
                    iVar85 = *(int *)(local_960.hit + 0x130);
                    iVar86 = *(int *)(local_960.hit + 0x134);
                    iVar87 = *(int *)(local_960.hit + 0x138);
                    iVar88 = *(int *)(local_960.hit + 0x13c);
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar26 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x400) =
                         (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x100) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x400);
                    *(uint *)(local_960.ray + 0x404) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x404);
                    *(uint *)(local_960.ray + 0x408) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x408);
                    *(uint *)(local_960.ray + 0x40c) =
                         (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x40c);
                    *(uint *)(local_960.ray + 0x410) =
                         (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x410);
                    *(uint *)(local_960.ray + 0x414) =
                         (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x414);
                    *(uint *)(local_960.ray + 0x418) =
                         (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x418);
                    *(uint *)(local_960.ray + 0x41c) =
                         (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x41c);
                    *(uint *)(local_960.ray + 0x420) =
                         (uint)(bVar95 & 1) * iVar81 |
                         (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x420);
                    *(uint *)(local_960.ray + 0x424) =
                         (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x424);
                    *(uint *)(local_960.ray + 0x428) =
                         (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x428);
                    *(uint *)(local_960.ray + 0x42c) =
                         (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x42c);
                    *(uint *)(local_960.ray + 0x430) =
                         (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x430);
                    *(uint *)(local_960.ray + 0x434) =
                         (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x434);
                    *(uint *)(local_960.ray + 0x438) =
                         (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x438);
                    *(uint *)(local_960.ray + 0x43c) =
                         (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x43c);
                    auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x140));
                    auVar155 = vmovdqu32_avx512f(auVar155);
                    *(undefined1 (*) [64])(local_960.ray + 0x440) = auVar155;
                    auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x180));
                    auVar155 = vmovdqu32_avx512f(auVar155);
                    *(undefined1 (*) [64])(local_960.ray + 0x480) = auVar155;
                    auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x1c0));
                    auVar155 = vmovdqa32_avx512f(auVar155);
                    *(undefined1 (*) [64])(local_960.ray + 0x4c0) = auVar155;
                    auVar155 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x200));
                    auVar155 = vmovdqa32_avx512f(auVar155);
                    *(undefined1 (*) [64])(local_960.ray + 0x500) = auVar155;
                  }
                  auVar121 = auVar250._0_32_;
                  bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar104;
                  uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar50._4_4_ = uVar164;
                  auVar50._0_4_ = uVar164;
                  auVar50._8_4_ = uVar164;
                  auVar50._12_4_ = uVar164;
                  auVar50._16_4_ = uVar164;
                  auVar50._20_4_ = uVar164;
                  auVar50._24_4_ = uVar164;
                  auVar50._28_4_ = uVar164;
                  uVar165 = vcmpps_avx512vl(local_860,auVar50,2);
                  bVar104 = bVar96 & (byte)uVar165;
                  if ((bVar96 & (byte)uVar165) != 0) {
                    auVar179._8_4_ = 0x7f800000;
                    auVar179._0_8_ = 0x7f8000007f800000;
                    auVar179._12_4_ = 0x7f800000;
                    auVar179._16_4_ = 0x7f800000;
                    auVar179._20_4_ = 0x7f800000;
                    auVar179._24_4_ = 0x7f800000;
                    auVar179._28_4_ = 0x7f800000;
                    auVar131 = vblendmps_avx512vl(auVar179,local_860);
                    auVar154._0_4_ =
                         (uint)(bVar104 & 1) * auVar131._0_4_ |
                         (uint)!(bool)(bVar104 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 1 & 1);
                    auVar154._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 2 & 1);
                    auVar154._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 3 & 1);
                    auVar154._12_4_ = (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 4 & 1);
                    auVar154._16_4_ = (uint)bVar13 * auVar131._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 5 & 1);
                    auVar154._20_4_ = (uint)bVar13 * auVar131._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar104 >> 6 & 1);
                    auVar154._24_4_ = (uint)bVar13 * auVar131._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar154._28_4_ =
                         (uint)(bVar104 >> 7) * auVar131._28_4_ |
                         (uint)!(bool)(bVar104 >> 7) * 0x7f800000;
                    auVar131 = vshufps_avx(auVar154,auVar154,0xb1);
                    auVar131 = vminps_avx(auVar154,auVar131);
                    auVar133 = vshufpd_avx(auVar131,auVar131,5);
                    auVar131 = vminps_avx(auVar131,auVar133);
                    auVar133 = vpermpd_avx2(auVar131,0x4e);
                    auVar131 = vminps_avx(auVar131,auVar133);
                    uVar165 = vcmpps_avx512vl(auVar154,auVar131,0);
                    bVar95 = (byte)uVar165 & bVar104;
                    bVar96 = bVar104;
                    if (bVar95 != 0) {
                      bVar96 = bVar95;
                    }
                    uVar36 = 0;
                    for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000
                        ) {
                      uVar36 = uVar36 + 1;
                    }
                    uVar97 = (ulong)uVar36;
                  }
                  fVar212 = auVar238._0_4_;
                } while (bVar104 != 0);
              }
            }
          }
        }
      }
      local_780 = fVar212;
      if (8 < iVar8) {
        auVar131 = vpbroadcastd_avx512vl();
        auVar250 = ZEXT3264(auVar131);
        fStack_6b0 = 1.0 / (float)local_6c0._0_4_;
        local_6c0._4_4_ = fStack_6b0;
        local_6c0._0_4_ = fStack_6b0;
        fStack_6b8 = fStack_6b0;
        fStack_6b4 = fStack_6b0;
        auVar238 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar238);
        auVar238 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar238);
        lVar99 = 8;
        fStack_77c = local_780;
        fStack_778 = local_780;
        fStack_774 = local_780;
        fStack_770 = local_780;
        fStack_76c = local_780;
        fStack_768 = local_780;
        fStack_764 = local_780;
        local_760 = auVar121;
        local_6e0 = fVar204;
        uStack_6dc = fVar204;
        uStack_6d8 = fVar204;
        uStack_6d4 = fVar204;
        uStack_6d0 = fVar204;
        uStack_6cc = fVar204;
        uStack_6c8 = fVar204;
        uStack_6c4 = fVar204;
        fStack_6ac = fStack_6b0;
        fStack_6a8 = fStack_6b0;
        fStack_6a4 = fStack_6b0;
        do {
          auVar131 = vpbroadcastd_avx512vl();
          auVar116 = vpor_avx2(auVar131,_DAT_0205a920);
          uVar34 = vpcmpgtd_avx512vl(auVar250._0_32_,auVar116);
          auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 * 4 + lVar37);
          auVar133 = *(undefined1 (*) [32])(lVar37 + 0x2227768 + lVar99 * 4);
          auVar129 = *(undefined1 (*) [32])(lVar37 + 0x2227bec + lVar99 * 4);
          auVar128 = *(undefined1 (*) [32])(lVar37 + 0x2228070 + lVar99 * 4);
          local_800 = auVar180._0_32_;
          auVar117 = vmulps_avx512vl(local_800,auVar128);
          local_820 = auVar248._0_32_;
          auVar127 = vmulps_avx512vl(local_820,auVar128);
          auVar57._4_4_ = auVar128._4_4_ * (float)local_380._4_4_;
          auVar57._0_4_ = auVar128._0_4_ * (float)local_380._0_4_;
          auVar57._8_4_ = auVar128._8_4_ * fStack_378;
          auVar57._12_4_ = auVar128._12_4_ * fStack_374;
          auVar57._16_4_ = auVar128._16_4_ * fStack_370;
          auVar57._20_4_ = auVar128._20_4_ * fStack_36c;
          auVar57._24_4_ = auVar128._24_4_ * fStack_368;
          auVar57._28_4_ = auVar116._28_4_;
          auVar136 = auVar249._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar117,auVar129,auVar136);
          local_7e0 = auVar247._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar127,auVar129,local_7e0);
          auVar127 = vfmadd231ps_avx512vl(auVar57,auVar129,local_360);
          auVar135 = auVar245._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar133,auVar135);
          auVar132 = auVar242._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar133,auVar132);
          auVar111 = vfmadd231ps_fma(auVar127,auVar133,local_340);
          auVar134 = auVar243._0_32_;
          auVar120 = vfmadd231ps_avx512vl(auVar116,auVar131,auVar134);
          local_700 = auVar244._0_32_;
          auVar122 = vfmadd231ps_avx512vl(auVar117,auVar131,local_700);
          auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 * 4 + lVar37);
          auVar117 = *(undefined1 (*) [32])(lVar37 + 0x2229b88 + lVar99 * 4);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar131,local_320);
          auVar127 = *(undefined1 (*) [32])(lVar37 + 0x222a00c + lVar99 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar37 + 0x222a490 + lVar99 * 4);
          auVar121 = vmulps_avx512vl(local_800,auVar118);
          auVar119 = vmulps_avx512vl(local_820,auVar118);
          auVar58._4_4_ = auVar118._4_4_ * (float)local_380._4_4_;
          auVar58._0_4_ = auVar118._0_4_ * (float)local_380._0_4_;
          auVar58._8_4_ = auVar118._8_4_ * fStack_378;
          auVar58._12_4_ = auVar118._12_4_ * fStack_374;
          auVar58._16_4_ = auVar118._16_4_ * fStack_370;
          auVar58._20_4_ = auVar118._20_4_ * fStack_36c;
          auVar58._24_4_ = auVar118._24_4_ * fStack_368;
          auVar58._28_4_ = uStack_364;
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,auVar136);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar127,local_7e0);
          auVar123 = vfmadd231ps_avx512vl(auVar58,auVar127,local_360);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar135);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,auVar132);
          auVar110 = vfmadd231ps_fma(auVar123,auVar117,local_340);
          auVar123 = vfmadd231ps_avx512vl(auVar121,auVar116,auVar134);
          auVar124 = vfmadd231ps_avx512vl(auVar119,auVar116,local_700);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar116,local_320);
          auVar125 = vmaxps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar110));
          auVar121 = vsubps_avx(auVar123,auVar120);
          auVar119 = vsubps_avx(auVar124,auVar122);
          auVar126 = vmulps_avx512vl(auVar122,auVar121);
          auVar130 = vmulps_avx512vl(auVar120,auVar119);
          auVar126 = vsubps_avx512vl(auVar126,auVar130);
          auVar130 = vmulps_avx512vl(auVar119,auVar119);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar121,auVar121);
          auVar125 = vmulps_avx512vl(auVar125,auVar125);
          auVar125 = vmulps_avx512vl(auVar125,auVar130);
          auVar126 = vmulps_avx512vl(auVar126,auVar126);
          uVar165 = vcmpps_avx512vl(auVar126,auVar125,2);
          local_5f0 = (byte)uVar34 & (byte)uVar165;
          if (local_5f0 == 0) {
            auVar238 = ZEXT3264(auVar132);
            auVar249 = ZEXT3264(auVar136);
          }
          else {
            auVar118 = vmulps_avx512vl(local_760,auVar118);
            auVar127 = vfmadd213ps_avx512vl(auVar127,local_3e0,auVar118);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_3c0,auVar127);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_3a0,auVar117);
            auVar128 = vmulps_avx512vl(local_760,auVar128);
            auVar129 = vfmadd213ps_avx512vl(auVar129,local_3e0,auVar128);
            auVar133 = vfmadd213ps_avx512vl(auVar133,local_3c0,auVar129);
            auVar117 = vfmadd213ps_avx512vl(auVar131,local_3a0,auVar133);
            auVar131 = *(undefined1 (*) [32])(lVar37 + 0x22284f4 + lVar99 * 4);
            auVar133 = *(undefined1 (*) [32])(lVar37 + 0x2228978 + lVar99 * 4);
            auVar129 = *(undefined1 (*) [32])(lVar37 + 0x2228dfc + lVar99 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar37 + 0x2229280 + lVar99 * 4);
            auVar127 = vmulps_avx512vl(local_800,auVar128);
            auVar118 = vmulps_avx512vl(local_820,auVar128);
            auVar128 = vmulps_avx512vl(local_760,auVar128);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar129,auVar136);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar129,local_7e0);
            auVar129 = vfmadd231ps_avx512vl(auVar128,local_3e0,auVar129);
            auVar128 = vfmadd231ps_avx512vl(auVar127,auVar133,auVar135);
            auVar127 = vfmadd231ps_avx512vl(auVar118,auVar133,auVar132);
            auVar133 = vfmadd231ps_avx512vl(auVar129,local_3c0,auVar133);
            auVar128 = vfmadd231ps_avx512vl(auVar128,auVar131,auVar134);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar131,local_700);
            auVar118 = vfmadd231ps_avx512vl(auVar133,local_3a0,auVar131);
            auVar131 = *(undefined1 (*) [32])(lVar37 + 0x222a914 + lVar99 * 4);
            auVar133 = *(undefined1 (*) [32])(lVar37 + 0x222b21c + lVar99 * 4);
            auVar129 = *(undefined1 (*) [32])(lVar37 + 0x222b6a0 + lVar99 * 4);
            auVar125 = vmulps_avx512vl(local_800,auVar129);
            auVar126 = vmulps_avx512vl(local_820,auVar129);
            auVar129 = vmulps_avx512vl(local_760,auVar129);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar133,auVar136);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar133,local_7e0);
            auVar129 = vfmadd231ps_avx512vl(auVar129,local_3e0,auVar133);
            auVar133 = *(undefined1 (*) [32])(lVar37 + 0x222ad98 + lVar99 * 4);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar133,auVar135);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar133,auVar132);
            auVar133 = vfmadd231ps_avx512vl(auVar129,local_3c0,auVar133);
            auVar129 = vfmadd231ps_avx512vl(auVar125,auVar131,auVar134);
            auVar125 = vfmadd231ps_avx512vl(auVar126,auVar131,local_700);
            auVar133 = vfmadd231ps_avx512vl(auVar133,local_3a0,auVar131);
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar128,auVar126);
            vandps_avx512vl(auVar127,auVar126);
            auVar131 = vmaxps_avx(auVar126,auVar126);
            vandps_avx512vl(auVar118,auVar126);
            auVar131 = vmaxps_avx(auVar131,auVar126);
            auVar93._4_4_ = fStack_77c;
            auVar93._0_4_ = local_780;
            auVar93._8_4_ = fStack_778;
            auVar93._12_4_ = fStack_774;
            auVar93._16_4_ = fStack_770;
            auVar93._20_4_ = fStack_76c;
            auVar93._24_4_ = fStack_768;
            auVar93._28_4_ = fStack_764;
            uVar97 = vcmpps_avx512vl(auVar131,auVar93,1);
            bVar13 = (bool)((byte)uVar97 & 1);
            auVar143._0_4_ = (float)((uint)bVar13 * auVar121._0_4_ | (uint)!bVar13 * auVar128._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar128._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar128._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar128._12_4_);
            bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar143._16_4_ =
                 (float)((uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * auVar128._16_4_);
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar143._20_4_ =
                 (float)((uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * auVar128._20_4_);
            bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar143._24_4_ =
                 (float)((uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * auVar128._24_4_);
            bVar13 = SUB81(uVar97 >> 7,0);
            auVar143._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * auVar128._28_4_;
            bVar13 = (bool)((byte)uVar97 & 1);
            auVar144._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar127._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar127._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar127._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar127._12_4_);
            bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar144._16_4_ =
                 (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar127._16_4_);
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar144._20_4_ =
                 (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar127._20_4_);
            bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar144._24_4_ =
                 (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar127._24_4_);
            bVar13 = SUB81(uVar97 >> 7,0);
            auVar144._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar127._28_4_;
            vandps_avx512vl(auVar129,auVar126);
            vandps_avx512vl(auVar125,auVar126);
            auVar131 = vmaxps_avx(auVar144,auVar144);
            vandps_avx512vl(auVar133,auVar126);
            auVar131 = vmaxps_avx(auVar131,auVar144);
            uVar97 = vcmpps_avx512vl(auVar131,auVar93,1);
            bVar13 = (bool)((byte)uVar97 & 1);
            auVar145._0_4_ = (uint)bVar13 * auVar121._0_4_ | (uint)!bVar13 * auVar129._0_4_;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar145._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar129._4_4_;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar145._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar129._8_4_;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar145._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar129._12_4_;
            bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar145._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * auVar129._16_4_;
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar145._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * auVar129._20_4_;
            bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar145._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * auVar129._24_4_;
            bVar13 = SUB81(uVar97 >> 7,0);
            auVar145._28_4_ = (uint)bVar13 * auVar121._28_4_ | (uint)!bVar13 * auVar129._28_4_;
            bVar13 = (bool)((byte)uVar97 & 1);
            auVar146._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar125._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar125._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar125._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar125._12_4_);
            bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar146._16_4_ =
                 (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar125._16_4_);
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar146._20_4_ =
                 (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar125._20_4_);
            bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar146._24_4_ =
                 (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar125._24_4_);
            bVar13 = SUB81(uVar97 >> 7,0);
            auVar146._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar125._28_4_;
            auVar232._8_4_ = 0x80000000;
            auVar232._0_8_ = 0x8000000080000000;
            auVar232._12_4_ = 0x80000000;
            auVar232._16_4_ = 0x80000000;
            auVar232._20_4_ = 0x80000000;
            auVar232._24_4_ = 0x80000000;
            auVar232._28_4_ = 0x80000000;
            auVar131 = vxorps_avx512vl(auVar145,auVar232);
            auVar125 = auVar246._0_32_;
            auVar133 = vfmadd213ps_avx512vl(auVar143,auVar143,auVar125);
            auVar112 = vfmadd231ps_fma(auVar133,auVar144,auVar144);
            auVar133 = vrsqrt14ps_avx512vl(ZEXT1632(auVar112));
            auVar241._8_4_ = 0xbf000000;
            auVar241._0_8_ = 0xbf000000bf000000;
            auVar241._12_4_ = 0xbf000000;
            auVar241._16_4_ = 0xbf000000;
            auVar241._20_4_ = 0xbf000000;
            auVar241._24_4_ = 0xbf000000;
            auVar241._28_4_ = 0xbf000000;
            fVar204 = auVar133._0_4_;
            fVar212 = auVar133._4_4_;
            fVar203 = auVar133._8_4_;
            fVar211 = auVar133._12_4_;
            fVar213 = auVar133._16_4_;
            fVar214 = auVar133._20_4_;
            fVar194 = auVar133._24_4_;
            auVar59._4_4_ = fVar212 * fVar212 * fVar212 * auVar112._4_4_ * -0.5;
            auVar59._0_4_ = fVar204 * fVar204 * fVar204 * auVar112._0_4_ * -0.5;
            auVar59._8_4_ = fVar203 * fVar203 * fVar203 * auVar112._8_4_ * -0.5;
            auVar59._12_4_ = fVar211 * fVar211 * fVar211 * auVar112._12_4_ * -0.5;
            auVar59._16_4_ = fVar213 * fVar213 * fVar213 * -0.0;
            auVar59._20_4_ = fVar214 * fVar214 * fVar214 * -0.0;
            auVar59._24_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar59._28_4_ = auVar144._28_4_;
            auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar133 = vfmadd231ps_avx512vl(auVar59,auVar129,auVar133);
            auVar60._4_4_ = auVar144._4_4_ * auVar133._4_4_;
            auVar60._0_4_ = auVar144._0_4_ * auVar133._0_4_;
            auVar60._8_4_ = auVar144._8_4_ * auVar133._8_4_;
            auVar60._12_4_ = auVar144._12_4_ * auVar133._12_4_;
            auVar60._16_4_ = auVar144._16_4_ * auVar133._16_4_;
            auVar60._20_4_ = auVar144._20_4_ * auVar133._20_4_;
            auVar60._24_4_ = auVar144._24_4_ * auVar133._24_4_;
            auVar60._28_4_ = 0;
            auVar61._4_4_ = auVar133._4_4_ * -auVar143._4_4_;
            auVar61._0_4_ = auVar133._0_4_ * -auVar143._0_4_;
            auVar61._8_4_ = auVar133._8_4_ * -auVar143._8_4_;
            auVar61._12_4_ = auVar133._12_4_ * -auVar143._12_4_;
            auVar61._16_4_ = auVar133._16_4_ * -auVar143._16_4_;
            auVar61._20_4_ = auVar133._20_4_ * -auVar143._20_4_;
            auVar61._24_4_ = auVar133._24_4_ * -auVar143._24_4_;
            auVar61._28_4_ = auVar144._28_4_;
            auVar128 = vmulps_avx512vl(auVar133,auVar125);
            auVar133 = vfmadd213ps_avx512vl(auVar145,auVar145,auVar125);
            auVar133 = vfmadd231ps_avx512vl(auVar133,auVar146,auVar146);
            auVar127 = vrsqrt14ps_avx512vl(auVar133);
            auVar133 = vmulps_avx512vl(auVar133,auVar241);
            fVar204 = auVar127._0_4_;
            fVar212 = auVar127._4_4_;
            fVar203 = auVar127._8_4_;
            fVar211 = auVar127._12_4_;
            fVar213 = auVar127._16_4_;
            fVar214 = auVar127._20_4_;
            fVar194 = auVar127._24_4_;
            auVar62._4_4_ = fVar212 * fVar212 * fVar212 * auVar133._4_4_;
            auVar62._0_4_ = fVar204 * fVar204 * fVar204 * auVar133._0_4_;
            auVar62._8_4_ = fVar203 * fVar203 * fVar203 * auVar133._8_4_;
            auVar62._12_4_ = fVar211 * fVar211 * fVar211 * auVar133._12_4_;
            auVar62._16_4_ = fVar213 * fVar213 * fVar213 * auVar133._16_4_;
            auVar62._20_4_ = fVar214 * fVar214 * fVar214 * auVar133._20_4_;
            auVar62._24_4_ = fVar194 * fVar194 * fVar194 * auVar133._24_4_;
            auVar62._28_4_ = auVar133._28_4_;
            auVar133 = vfmadd231ps_avx512vl(auVar62,auVar129,auVar127);
            auVar63._4_4_ = auVar146._4_4_ * auVar133._4_4_;
            auVar63._0_4_ = auVar146._0_4_ * auVar133._0_4_;
            auVar63._8_4_ = auVar146._8_4_ * auVar133._8_4_;
            auVar63._12_4_ = auVar146._12_4_ * auVar133._12_4_;
            auVar63._16_4_ = auVar146._16_4_ * auVar133._16_4_;
            auVar63._20_4_ = auVar146._20_4_ * auVar133._20_4_;
            auVar63._24_4_ = auVar146._24_4_ * auVar133._24_4_;
            auVar63._28_4_ = auVar127._28_4_;
            auVar64._4_4_ = auVar133._4_4_ * auVar131._4_4_;
            auVar64._0_4_ = auVar133._0_4_ * auVar131._0_4_;
            auVar64._8_4_ = auVar133._8_4_ * auVar131._8_4_;
            auVar64._12_4_ = auVar133._12_4_ * auVar131._12_4_;
            auVar64._16_4_ = auVar133._16_4_ * auVar131._16_4_;
            auVar64._20_4_ = auVar133._20_4_ * auVar131._20_4_;
            auVar64._24_4_ = auVar133._24_4_ * auVar131._24_4_;
            auVar64._28_4_ = auVar131._28_4_;
            auVar131 = vmulps_avx512vl(auVar133,auVar125);
            auVar112 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar111),auVar120);
            auVar133 = ZEXT1632(auVar111);
            auVar28 = vfmadd213ps_fma(auVar61,auVar133,auVar122);
            auVar129 = vfmadd213ps_avx512vl(auVar128,auVar133,auVar117);
            auVar127 = vfmadd213ps_avx512vl(auVar63,ZEXT1632(auVar110),auVar123);
            auVar33 = vfnmadd213ps_fma(auVar60,auVar133,auVar120);
            auVar118 = ZEXT1632(auVar110);
            auVar29 = vfmadd213ps_fma(auVar64,auVar118,auVar124);
            auVar113 = vfnmadd213ps_fma(auVar61,auVar133,auVar122);
            auVar30 = vfmadd213ps_fma(auVar131,auVar118,auVar116);
            auVar122 = ZEXT1632(auVar111);
            auVar115 = vfnmadd231ps_fma(auVar117,auVar122,auVar128);
            auVar114 = vfnmadd213ps_fma(auVar63,auVar118,auVar123);
            auVar39 = vfnmadd213ps_fma(auVar64,auVar118,auVar124);
            auVar38 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar110),auVar131);
            auVar116 = vsubps_avx512vl(auVar127,ZEXT1632(auVar33));
            auVar131 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar113));
            auVar133 = vsubps_avx(ZEXT1632(auVar30),ZEXT1632(auVar115));
            auVar65._4_4_ = auVar131._4_4_ * auVar115._4_4_;
            auVar65._0_4_ = auVar131._0_4_ * auVar115._0_4_;
            auVar65._8_4_ = auVar131._8_4_ * auVar115._8_4_;
            auVar65._12_4_ = auVar131._12_4_ * auVar115._12_4_;
            auVar65._16_4_ = auVar131._16_4_ * 0.0;
            auVar65._20_4_ = auVar131._20_4_ * 0.0;
            auVar65._24_4_ = auVar131._24_4_ * 0.0;
            auVar65._28_4_ = auVar128._28_4_;
            auVar111 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar113),auVar133);
            auVar66._4_4_ = auVar133._4_4_ * auVar33._4_4_;
            auVar66._0_4_ = auVar133._0_4_ * auVar33._0_4_;
            auVar66._8_4_ = auVar133._8_4_ * auVar33._8_4_;
            auVar66._12_4_ = auVar133._12_4_ * auVar33._12_4_;
            auVar66._16_4_ = auVar133._16_4_ * 0.0;
            auVar66._20_4_ = auVar133._20_4_ * 0.0;
            auVar66._24_4_ = auVar133._24_4_ * 0.0;
            auVar66._28_4_ = auVar133._28_4_;
            auVar31 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar115),auVar116);
            auVar67._4_4_ = auVar113._4_4_ * auVar116._4_4_;
            auVar67._0_4_ = auVar113._0_4_ * auVar116._0_4_;
            auVar67._8_4_ = auVar113._8_4_ * auVar116._8_4_;
            auVar67._12_4_ = auVar113._12_4_ * auVar116._12_4_;
            auVar67._16_4_ = auVar116._16_4_ * 0.0;
            auVar67._20_4_ = auVar116._20_4_ * 0.0;
            auVar67._24_4_ = auVar116._24_4_ * 0.0;
            auVar67._28_4_ = auVar116._28_4_;
            auVar32 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar33),auVar131);
            auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar125,ZEXT1632(auVar31));
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar125,ZEXT1632(auVar111));
            uVar97 = vcmpps_avx512vl(auVar131,auVar125,2);
            bVar104 = (byte)uVar97;
            fVar106 = (float)((uint)(bVar104 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * auVar114._0_4_);
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar158 = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar114._4_4_);
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar160 = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar114._8_4_);
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar162 = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar114._12_4_);
            auVar118 = ZEXT1632(CONCAT412(fVar162,CONCAT48(fVar160,CONCAT44(fVar158,fVar106))));
            fVar157 = (float)((uint)(bVar104 & 1) * auVar28._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * auVar39._0_4_);
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar159 = (float)((uint)bVar13 * auVar28._4_4_ | (uint)!bVar13 * auVar39._4_4_);
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar161 = (float)((uint)bVar13 * auVar28._8_4_ | (uint)!bVar13 * auVar39._8_4_);
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar163 = (float)((uint)bVar13 * auVar28._12_4_ | (uint)!bVar13 * auVar39._12_4_);
            auVar121 = ZEXT1632(CONCAT412(fVar163,CONCAT48(fVar161,CONCAT44(fVar159,fVar157))));
            auVar147._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar129._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar38._0_4_);
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar147._4_4_ = (float)((uint)bVar13 * auVar129._4_4_ | (uint)!bVar13 * auVar38._4_4_);
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar147._8_4_ = (float)((uint)bVar13 * auVar129._8_4_ | (uint)!bVar13 * auVar38._8_4_);
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar147._12_4_ =
                 (float)((uint)bVar13 * auVar129._12_4_ | (uint)!bVar13 * auVar38._12_4_);
            fVar212 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar129._16_4_);
            auVar147._16_4_ = fVar212;
            fVar203 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar129._20_4_);
            auVar147._20_4_ = fVar203;
            fVar204 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar129._24_4_);
            auVar147._24_4_ = fVar204;
            iVar1 = (uint)(byte)(uVar97 >> 7) * auVar129._28_4_;
            auVar147._28_4_ = iVar1;
            auVar131 = vblendmps_avx512vl(ZEXT1632(auVar33),auVar127);
            auVar148._0_4_ =
                 (uint)(bVar104 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar104 & 1) * auVar111._0_4_;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * auVar111._4_4_;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * auVar111._8_4_;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * auVar111._12_4_;
            auVar148._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_;
            auVar148._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_;
            auVar148._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_;
            auVar148._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
            auVar131 = vblendmps_avx512vl(ZEXT1632(auVar113),ZEXT1632(auVar29));
            auVar149._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar131._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar112._0_4_);
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar149._4_4_ = (float)((uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * auVar112._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar149._8_4_ = (float)((uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * auVar112._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar149._12_4_ =
                 (float)((uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * auVar112._12_4_);
            fVar211 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_);
            auVar149._16_4_ = fVar211;
            fVar214 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_);
            auVar149._20_4_ = fVar214;
            fVar213 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_);
            auVar149._24_4_ = fVar213;
            auVar149._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
            auVar131 = vblendmps_avx512vl(ZEXT1632(auVar115),ZEXT1632(auVar30));
            auVar150._0_4_ =
                 (float)((uint)(bVar104 & 1) * auVar131._0_4_ |
                        (uint)!(bool)(bVar104 & 1) * auVar28._0_4_);
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar150._4_4_ = (float)((uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * auVar28._4_4_);
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar150._8_4_ = (float)((uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * auVar28._8_4_);
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar150._12_4_ =
                 (float)((uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * auVar28._12_4_);
            fVar105 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar131._16_4_);
            auVar150._16_4_ = fVar105;
            fVar194 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar131._20_4_);
            auVar150._20_4_ = fVar194;
            fVar202 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar131._24_4_);
            auVar150._24_4_ = fVar202;
            iVar2 = (uint)(byte)(uVar97 >> 7) * auVar131._28_4_;
            auVar150._28_4_ = iVar2;
            auVar151._0_4_ =
                 (uint)(bVar104 & 1) * (int)auVar33._0_4_ |
                 (uint)!(bool)(bVar104 & 1) * auVar127._0_4_;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar151._4_4_ = (uint)bVar13 * (int)auVar33._4_4_ | (uint)!bVar13 * auVar127._4_4_;
            bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar151._8_4_ = (uint)bVar13 * (int)auVar33._8_4_ | (uint)!bVar13 * auVar127._8_4_;
            bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar151._12_4_ = (uint)bVar13 * (int)auVar33._12_4_ | (uint)!bVar13 * auVar127._12_4_;
            auVar151._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar127._16_4_;
            auVar151._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar127._20_4_;
            auVar151._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar127._24_4_;
            auVar151._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar127._28_4_;
            bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar127 = vsubps_avx512vl(auVar151,auVar118);
            auVar133 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar113._12_4_ |
                                                     (uint)!bVar17 * auVar29._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar113._8_4_ |
                                                              (uint)!bVar15 * auVar29._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar113._4_4_ |
                                                                       (uint)!bVar13 * auVar29._4_4_
                                                                       ,(uint)(bVar104 & 1) *
                                                                        (int)auVar113._0_4_ |
                                                                        (uint)!(bool)(bVar104 & 1) *
                                                                        auVar29._0_4_)))),auVar121);
            auVar129 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar115._12_4_ |
                                                     (uint)!bVar18 * auVar30._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar115._8_4_ |
                                                              (uint)!bVar16 * auVar30._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar115._4_4_ |
                                                                       (uint)!bVar14 * auVar30._4_4_
                                                                       ,(uint)(bVar104 & 1) *
                                                                        (int)auVar115._0_4_ |
                                                                        (uint)!(bool)(bVar104 & 1) *
                                                                        auVar30._0_4_)))),auVar147);
            auVar128 = vsubps_avx(auVar118,auVar148);
            auVar116 = vsubps_avx(auVar121,auVar149);
            auVar117 = vsubps_avx(auVar147,auVar150);
            auVar68._4_4_ = auVar129._4_4_ * fVar158;
            auVar68._0_4_ = auVar129._0_4_ * fVar106;
            auVar68._8_4_ = auVar129._8_4_ * fVar160;
            auVar68._12_4_ = auVar129._12_4_ * fVar162;
            auVar68._16_4_ = auVar129._16_4_ * 0.0;
            auVar68._20_4_ = auVar129._20_4_ * 0.0;
            auVar68._24_4_ = auVar129._24_4_ * 0.0;
            auVar68._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar68,auVar147,auVar127);
            auVar201._0_4_ = fVar157 * auVar127._0_4_;
            auVar201._4_4_ = fVar159 * auVar127._4_4_;
            auVar201._8_4_ = fVar161 * auVar127._8_4_;
            auVar201._12_4_ = fVar163 * auVar127._12_4_;
            auVar201._16_4_ = auVar127._16_4_ * 0.0;
            auVar201._20_4_ = auVar127._20_4_ * 0.0;
            auVar201._24_4_ = auVar127._24_4_ * 0.0;
            auVar201._28_4_ = 0;
            auVar112 = vfmsub231ps_fma(auVar201,auVar118,auVar133);
            auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar112),auVar125,ZEXT1632(auVar111));
            auVar209._0_4_ = auVar133._0_4_ * auVar147._0_4_;
            auVar209._4_4_ = auVar133._4_4_ * auVar147._4_4_;
            auVar209._8_4_ = auVar133._8_4_ * auVar147._8_4_;
            auVar209._12_4_ = auVar133._12_4_ * auVar147._12_4_;
            auVar209._16_4_ = auVar133._16_4_ * fVar212;
            auVar209._20_4_ = auVar133._20_4_ * fVar203;
            auVar209._24_4_ = auVar133._24_4_ * fVar204;
            auVar209._28_4_ = 0;
            auVar111 = vfmsub231ps_fma(auVar209,auVar121,auVar129);
            auVar119 = vfmadd231ps_avx512vl(auVar131,auVar125,ZEXT1632(auVar111));
            auVar131 = vmulps_avx512vl(auVar117,auVar148);
            auVar131 = vfmsub231ps_avx512vl(auVar131,auVar128,auVar150);
            auVar69._4_4_ = auVar116._4_4_ * auVar150._4_4_;
            auVar69._0_4_ = auVar116._0_4_ * auVar150._0_4_;
            auVar69._8_4_ = auVar116._8_4_ * auVar150._8_4_;
            auVar69._12_4_ = auVar116._12_4_ * auVar150._12_4_;
            auVar69._16_4_ = auVar116._16_4_ * fVar105;
            auVar69._20_4_ = auVar116._20_4_ * fVar194;
            auVar69._24_4_ = auVar116._24_4_ * fVar202;
            auVar69._28_4_ = iVar2;
            auVar111 = vfmsub231ps_fma(auVar69,auVar149,auVar117);
            auVar210._0_4_ = auVar149._0_4_ * auVar128._0_4_;
            auVar210._4_4_ = auVar149._4_4_ * auVar128._4_4_;
            auVar210._8_4_ = auVar149._8_4_ * auVar128._8_4_;
            auVar210._12_4_ = auVar149._12_4_ * auVar128._12_4_;
            auVar210._16_4_ = fVar211 * auVar128._16_4_;
            auVar210._20_4_ = fVar214 * auVar128._20_4_;
            auVar210._24_4_ = fVar213 * auVar128._24_4_;
            auVar210._28_4_ = 0;
            auVar112 = vfmsub231ps_fma(auVar210,auVar116,auVar148);
            auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar112),auVar125,auVar131);
            auVar120 = vfmadd231ps_avx512vl(auVar131,auVar125,ZEXT1632(auVar111));
            auVar131 = vmaxps_avx(auVar119,auVar120);
            uVar165 = vcmpps_avx512vl(auVar131,auVar125,2);
            local_5f0 = local_5f0 & (byte)uVar165;
            if (local_5f0 == 0) {
LAB_01c187c9:
              local_5f0 = 0;
            }
            else {
              auVar70._4_4_ = auVar117._4_4_ * auVar133._4_4_;
              auVar70._0_4_ = auVar117._0_4_ * auVar133._0_4_;
              auVar70._8_4_ = auVar117._8_4_ * auVar133._8_4_;
              auVar70._12_4_ = auVar117._12_4_ * auVar133._12_4_;
              auVar70._16_4_ = auVar117._16_4_ * auVar133._16_4_;
              auVar70._20_4_ = auVar117._20_4_ * auVar133._20_4_;
              auVar70._24_4_ = auVar117._24_4_ * auVar133._24_4_;
              auVar70._28_4_ = auVar131._28_4_;
              auVar28 = vfmsub231ps_fma(auVar70,auVar116,auVar129);
              auVar71._4_4_ = auVar129._4_4_ * auVar128._4_4_;
              auVar71._0_4_ = auVar129._0_4_ * auVar128._0_4_;
              auVar71._8_4_ = auVar129._8_4_ * auVar128._8_4_;
              auVar71._12_4_ = auVar129._12_4_ * auVar128._12_4_;
              auVar71._16_4_ = auVar129._16_4_ * auVar128._16_4_;
              auVar71._20_4_ = auVar129._20_4_ * auVar128._20_4_;
              auVar71._24_4_ = auVar129._24_4_ * auVar128._24_4_;
              auVar71._28_4_ = auVar129._28_4_;
              auVar112 = vfmsub231ps_fma(auVar71,auVar127,auVar117);
              auVar72._4_4_ = auVar116._4_4_ * auVar127._4_4_;
              auVar72._0_4_ = auVar116._0_4_ * auVar127._0_4_;
              auVar72._8_4_ = auVar116._8_4_ * auVar127._8_4_;
              auVar72._12_4_ = auVar116._12_4_ * auVar127._12_4_;
              auVar72._16_4_ = auVar116._16_4_ * auVar127._16_4_;
              auVar72._20_4_ = auVar116._20_4_ * auVar127._20_4_;
              auVar72._24_4_ = auVar116._24_4_ * auVar127._24_4_;
              auVar72._28_4_ = auVar116._28_4_;
              auVar29 = vfmsub231ps_fma(auVar72,auVar128,auVar133);
              auVar111 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar29));
              auVar131 = vfmadd231ps_avx512vl(ZEXT1632(auVar111),ZEXT1632(auVar28),auVar125);
              auVar133 = vrcp14ps_avx512vl(auVar131);
              auVar45._8_4_ = 0x3f800000;
              auVar45._0_8_ = &DAT_3f8000003f800000;
              auVar45._12_4_ = 0x3f800000;
              auVar45._16_4_ = 0x3f800000;
              auVar45._20_4_ = 0x3f800000;
              auVar45._24_4_ = 0x3f800000;
              auVar45._28_4_ = 0x3f800000;
              auVar129 = vfnmadd213ps_avx512vl(auVar133,auVar131,auVar45);
              auVar111 = vfmadd132ps_fma(auVar129,auVar133,auVar133);
              auVar73._4_4_ = auVar29._4_4_ * auVar147._4_4_;
              auVar73._0_4_ = auVar29._0_4_ * auVar147._0_4_;
              auVar73._8_4_ = auVar29._8_4_ * auVar147._8_4_;
              auVar73._12_4_ = auVar29._12_4_ * auVar147._12_4_;
              auVar73._16_4_ = fVar212 * 0.0;
              auVar73._20_4_ = fVar203 * 0.0;
              auVar73._24_4_ = fVar204 * 0.0;
              auVar73._28_4_ = iVar1;
              auVar112 = vfmadd231ps_fma(auVar73,auVar121,ZEXT1632(auVar112));
              auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar118,ZEXT1632(auVar28));
              fVar204 = auVar111._0_4_;
              fVar212 = auVar111._4_4_;
              fVar203 = auVar111._8_4_;
              fVar211 = auVar111._12_4_;
              auVar133 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar211,
                                            CONCAT48(auVar112._8_4_ * fVar203,
                                                     CONCAT44(auVar112._4_4_ * fVar212,
                                                              auVar112._0_4_ * fVar204))));
              auVar94._4_4_ = uStack_6dc;
              auVar94._0_4_ = local_6e0;
              auVar94._8_4_ = uStack_6d8;
              auVar94._12_4_ = uStack_6d4;
              auVar94._16_4_ = uStack_6d0;
              auVar94._20_4_ = uStack_6cc;
              auVar94._24_4_ = uStack_6c8;
              auVar94._28_4_ = uStack_6c4;
              uVar165 = vcmpps_avx512vl(auVar133,auVar94,0xd);
              uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar46._4_4_ = uVar164;
              auVar46._0_4_ = uVar164;
              auVar46._8_4_ = uVar164;
              auVar46._12_4_ = uVar164;
              auVar46._16_4_ = uVar164;
              auVar46._20_4_ = uVar164;
              auVar46._24_4_ = uVar164;
              auVar46._28_4_ = uVar164;
              uVar34 = vcmpps_avx512vl(auVar133,auVar46,2);
              local_5f0 = (byte)uVar165 & (byte)uVar34 & local_5f0;
              if (local_5f0 == 0) goto LAB_01c187c9;
              uVar165 = vcmpps_avx512vl(auVar131,auVar125,4);
              if ((local_5f0 & (byte)uVar165) == 0) {
                local_5f0 = 0;
              }
              else {
                local_5f0 = local_5f0 & (byte)uVar165;
                fVar213 = auVar119._0_4_ * fVar204;
                fVar214 = auVar119._4_4_ * fVar212;
                auVar74._4_4_ = fVar214;
                auVar74._0_4_ = fVar213;
                fVar194 = auVar119._8_4_ * fVar203;
                auVar74._8_4_ = fVar194;
                fVar202 = auVar119._12_4_ * fVar211;
                auVar74._12_4_ = fVar202;
                fVar105 = auVar119._16_4_ * 0.0;
                auVar74._16_4_ = fVar105;
                fVar106 = auVar119._20_4_ * 0.0;
                auVar74._20_4_ = fVar106;
                fVar157 = auVar119._24_4_ * 0.0;
                auVar74._24_4_ = fVar157;
                auVar74._28_4_ = auVar119._28_4_;
                fVar204 = auVar120._0_4_ * fVar204;
                fVar212 = auVar120._4_4_ * fVar212;
                auVar75._4_4_ = fVar212;
                auVar75._0_4_ = fVar204;
                fVar203 = auVar120._8_4_ * fVar203;
                auVar75._8_4_ = fVar203;
                fVar211 = auVar120._12_4_ * fVar211;
                auVar75._12_4_ = fVar211;
                fVar158 = auVar120._16_4_ * 0.0;
                auVar75._16_4_ = fVar158;
                fVar159 = auVar120._20_4_ * 0.0;
                auVar75._20_4_ = fVar159;
                fVar160 = auVar120._24_4_ * 0.0;
                auVar75._24_4_ = fVar160;
                auVar75._28_4_ = auVar120._28_4_;
                auVar223._8_4_ = 0x3f800000;
                auVar223._0_8_ = &DAT_3f8000003f800000;
                auVar223._12_4_ = 0x3f800000;
                auVar223._16_4_ = 0x3f800000;
                auVar223._20_4_ = 0x3f800000;
                auVar223._24_4_ = 0x3f800000;
                auVar223._28_4_ = 0x3f800000;
                auVar131 = vsubps_avx(auVar223,auVar74);
                local_880._0_4_ =
                     (uint)(bVar104 & 1) * (int)fVar213 |
                     (uint)!(bool)(bVar104 & 1) * auVar131._0_4_;
                bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
                local_880._4_4_ = (uint)bVar13 * (int)fVar214 | (uint)!bVar13 * auVar131._4_4_;
                bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
                local_880._8_4_ = (uint)bVar13 * (int)fVar194 | (uint)!bVar13 * auVar131._8_4_;
                bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
                local_880._12_4_ = (uint)bVar13 * (int)fVar202 | (uint)!bVar13 * auVar131._12_4_;
                bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
                local_880._16_4_ = (uint)bVar13 * (int)fVar105 | (uint)!bVar13 * auVar131._16_4_;
                bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
                local_880._20_4_ = (uint)bVar13 * (int)fVar106 | (uint)!bVar13 * auVar131._20_4_;
                bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
                local_880._24_4_ = (uint)bVar13 * (int)fVar157 | (uint)!bVar13 * auVar131._24_4_;
                bVar13 = SUB81(uVar97 >> 7,0);
                local_880._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar131._28_4_;
                auVar131 = vsubps_avx(auVar223,auVar75);
                local_540._0_4_ =
                     (uint)(bVar104 & 1) * (int)fVar204 |
                     (uint)!(bool)(bVar104 & 1) * auVar131._0_4_;
                bVar13 = (bool)((byte)(uVar97 >> 1) & 1);
                local_540._4_4_ = (uint)bVar13 * (int)fVar212 | (uint)!bVar13 * auVar131._4_4_;
                bVar13 = (bool)((byte)(uVar97 >> 2) & 1);
                local_540._8_4_ = (uint)bVar13 * (int)fVar203 | (uint)!bVar13 * auVar131._8_4_;
                bVar13 = (bool)((byte)(uVar97 >> 3) & 1);
                local_540._12_4_ = (uint)bVar13 * (int)fVar211 | (uint)!bVar13 * auVar131._12_4_;
                bVar13 = (bool)((byte)(uVar97 >> 4) & 1);
                local_540._16_4_ = (uint)bVar13 * (int)fVar158 | (uint)!bVar13 * auVar131._16_4_;
                bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
                local_540._20_4_ = (uint)bVar13 * (int)fVar159 | (uint)!bVar13 * auVar131._20_4_;
                bVar13 = (bool)((byte)(uVar97 >> 6) & 1);
                local_540._24_4_ = (uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar131._24_4_;
                bVar13 = SUB81(uVar97 >> 7,0);
                local_540._28_4_ = (uint)bVar13 * auVar120._28_4_ | (uint)!bVar13 * auVar131._28_4_;
                local_8a0 = auVar133;
              }
            }
            auVar249 = ZEXT3264(local_920);
            auVar238 = ZEXT3264(local_900);
            if (local_5f0 != 0) {
              auVar131 = vsubps_avx(ZEXT1632(auVar110),auVar122);
              auVar111 = vfmadd213ps_fma(auVar131,local_880,auVar122);
              uVar164 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar47._4_4_ = uVar164;
              auVar47._0_4_ = uVar164;
              auVar47._8_4_ = uVar164;
              auVar47._12_4_ = uVar164;
              auVar47._16_4_ = uVar164;
              auVar47._20_4_ = uVar164;
              auVar47._24_4_ = uVar164;
              auVar47._28_4_ = uVar164;
              auVar131 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar111._12_4_ + auVar111._12_4_,
                                                            CONCAT48(auVar111._8_4_ + auVar111._8_4_
                                                                     ,CONCAT44(auVar111._4_4_ +
                                                                               auVar111._4_4_,
                                                                               auVar111._0_4_ +
                                                                               auVar111._0_4_)))),
                                         auVar47);
              uVar165 = vcmpps_avx512vl(local_8a0,auVar131,6);
              local_5f0 = local_5f0 & (byte)uVar165;
              if (local_5f0 != 0) {
                auVar176._8_4_ = 0xbf800000;
                auVar176._0_8_ = 0xbf800000bf800000;
                auVar176._12_4_ = 0xbf800000;
                auVar176._16_4_ = 0xbf800000;
                auVar176._20_4_ = 0xbf800000;
                auVar176._24_4_ = 0xbf800000;
                auVar176._28_4_ = 0xbf800000;
                auVar48._8_4_ = 0x40000000;
                auVar48._0_8_ = 0x4000000040000000;
                auVar48._12_4_ = 0x40000000;
                auVar48._16_4_ = 0x40000000;
                auVar48._20_4_ = 0x40000000;
                auVar48._24_4_ = 0x40000000;
                auVar48._28_4_ = 0x40000000;
                local_680 = vfmadd132ps_avx512vl(local_540,auVar176,auVar48);
                local_540 = local_680;
                auVar131 = local_540;
                local_640 = (undefined4)lVar99;
                local_630 = local_970;
                uStack_628 = uStack_968;
                local_620 = local_8b0._0_8_;
                uStack_618 = local_8b0._8_8_;
                local_610 = local_8c0._0_8_;
                uStack_608 = local_8c0._8_8_;
                local_600 = local_8d0;
                uStack_5f8 = uStack_8c8;
                pGVar101 = (context->scene->geometries).items[uVar102].ptr;
                local_540 = auVar131;
                if ((pGVar101->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar111 = vcvtsi2ss_avx512f(auVar242._0_16_,local_640);
                  fVar204 = auVar111._0_4_;
                  local_5e0[0] = (fVar204 + local_880._0_4_ + 0.0) * (float)local_6c0._0_4_;
                  local_5e0[1] = (fVar204 + local_880._4_4_ + 1.0) * (float)local_6c0._4_4_;
                  local_5e0[2] = (fVar204 + local_880._8_4_ + 2.0) * fStack_6b8;
                  local_5e0[3] = (fVar204 + local_880._12_4_ + 3.0) * fStack_6b4;
                  fStack_5d0 = (fVar204 + local_880._16_4_ + 4.0) * fStack_6b0;
                  fStack_5cc = (fVar204 + local_880._20_4_ + 5.0) * fStack_6ac;
                  fStack_5c8 = (fVar204 + local_880._24_4_ + 6.0) * fStack_6a8;
                  fStack_5c4 = fVar204 + local_880._28_4_ + 7.0;
                  local_540._0_8_ = local_680._0_8_;
                  local_540._8_8_ = local_680._8_8_;
                  local_540._16_8_ = local_680._16_8_;
                  local_540._24_8_ = local_680._24_8_;
                  local_5c0 = local_540._0_8_;
                  uStack_5b8 = local_540._8_8_;
                  uStack_5b0 = local_540._16_8_;
                  uStack_5a8 = local_540._24_8_;
                  local_5a0 = local_8a0;
                  auVar177._8_4_ = 0x7f800000;
                  auVar177._0_8_ = 0x7f8000007f800000;
                  auVar177._12_4_ = 0x7f800000;
                  auVar177._16_4_ = 0x7f800000;
                  auVar177._20_4_ = 0x7f800000;
                  auVar177._24_4_ = 0x7f800000;
                  auVar177._28_4_ = 0x7f800000;
                  auVar131 = vblendmps_avx512vl(auVar177,local_8a0);
                  auVar152._0_4_ =
                       (uint)(local_5f0 & 1) * auVar131._0_4_ |
                       (uint)!(bool)(local_5f0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 1 & 1);
                  auVar152._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 2 & 1);
                  auVar152._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 3 & 1);
                  auVar152._12_4_ = (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 4 & 1);
                  auVar152._16_4_ = (uint)bVar13 * auVar131._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 5 & 1);
                  auVar152._20_4_ = (uint)bVar13 * auVar131._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 6 & 1);
                  auVar152._24_4_ = (uint)bVar13 * auVar131._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar152._28_4_ =
                       (uint)(local_5f0 >> 7) * auVar131._28_4_ |
                       (uint)!(bool)(local_5f0 >> 7) * 0x7f800000;
                  auVar131 = vshufps_avx(auVar152,auVar152,0xb1);
                  auVar131 = vminps_avx(auVar152,auVar131);
                  auVar133 = vshufpd_avx(auVar131,auVar131,5);
                  auVar131 = vminps_avx(auVar131,auVar133);
                  auVar133 = vpermpd_avx2(auVar131,0x4e);
                  auVar131 = vminps_avx(auVar131,auVar133);
                  uVar165 = vcmpps_avx512vl(auVar152,auVar131,0);
                  bVar96 = (byte)uVar165 & local_5f0;
                  bVar104 = local_5f0;
                  if (bVar96 != 0) {
                    bVar104 = bVar96;
                  }
                  uVar36 = 0;
                  for (uVar98 = (uint)bVar104; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000)
                  {
                    uVar36 = uVar36 + 1;
                  }
                  uVar97 = (ulong)uVar36;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar101->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar204 = local_5e0[uVar97];
                    uVar164 = *(undefined4 *)((long)&local_5c0 + uVar97 * 4);
                    fVar203 = 1.0 - fVar204;
                    fVar212 = fVar203 * fVar203 * -3.0;
                    auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                               ZEXT416((uint)(fVar204 * fVar203)),
                                               ZEXT416(0xc0000000));
                    auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar204 * fVar203)),
                                               ZEXT416((uint)(fVar204 * fVar204)),
                                               ZEXT416(0x40000000));
                    fVar203 = auVar111._0_4_ * 3.0;
                    fVar211 = auVar110._0_4_ * 3.0;
                    fVar213 = fVar204 * fVar204 * 3.0;
                    auVar219._0_4_ = fVar213 * (float)local_8d0._0_4_;
                    auVar219._4_4_ = fVar213 * (float)local_8d0._4_4_;
                    auVar219._8_4_ = fVar213 * (float)uStack_8c8;
                    auVar219._12_4_ = fVar213 * uStack_8c8._4_4_;
                    auVar192._4_4_ = fVar211;
                    auVar192._0_4_ = fVar211;
                    auVar192._8_4_ = fVar211;
                    auVar192._12_4_ = fVar211;
                    auVar111 = vfmadd132ps_fma(auVar192,auVar219,local_8c0);
                    auVar198._4_4_ = fVar203;
                    auVar198._0_4_ = fVar203;
                    auVar198._8_4_ = fVar203;
                    auVar198._12_4_ = fVar203;
                    auVar111 = vfmadd132ps_fma(auVar198,auVar111,local_8b0);
                    auVar193._4_4_ = fVar212;
                    auVar193._0_4_ = fVar212;
                    auVar193._8_4_ = fVar212;
                    auVar193._12_4_ = fVar212;
                    auVar111 = vfmadd132ps_fma(auVar193,auVar111,auVar27);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar111._0_4_;
                    uVar9 = vextractps_avx(auVar111,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar111,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar204;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar164;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar102;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_7b0 = local_8b0._0_8_;
                    uStack_7a8 = local_8b0._8_8_;
                    local_7c0 = local_8c0._0_4_;
                    fStack_7bc = local_8c0._4_4_;
                    fStack_7b8 = local_8c0._8_4_;
                    fStack_7b4 = local_8c0._12_4_;
                    _local_8e0 = _local_8d0;
                    local_4e0 = vmovdqa64_avx512vl(auVar250._0_32_);
                    local_930 = pGVar101;
                    local_6a0 = local_880;
                    local_660 = local_8a0;
                    local_63c = iVar8;
                    bVar104 = local_5f0;
                    do {
                      auVar242 = local_4c0;
                      auVar112 = auVar246._0_16_;
                      local_7a0 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar97]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_5c0 + uVar97 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar97 * 4)
                      ;
                      local_960.context = context->user;
                      fVar211 = local_200._0_4_;
                      fVar212 = 1.0 - fVar211;
                      fVar204 = fVar212 * fVar212 * -3.0;
                      auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar212)),
                                                 ZEXT416((uint)(fVar211 * fVar212)),
                                                 ZEXT416(0xc0000000));
                      auVar110 = vfmsub132ss_fma(ZEXT416((uint)(fVar211 * fVar212)),
                                                 ZEXT416((uint)(fVar211 * fVar211)),
                                                 ZEXT416(0x40000000));
                      fVar212 = auVar111._0_4_ * 3.0;
                      fVar203 = auVar110._0_4_ * 3.0;
                      fVar211 = fVar211 * fVar211 * 3.0;
                      auVar220._0_4_ = fVar211 * (float)local_8e0._0_4_;
                      auVar220._4_4_ = fVar211 * (float)local_8e0._4_4_;
                      auVar220._8_4_ = fVar211 * fStack_8d8;
                      auVar220._12_4_ = fVar211 * fStack_8d4;
                      auVar170._4_4_ = fVar203;
                      auVar170._0_4_ = fVar203;
                      auVar170._8_4_ = fVar203;
                      auVar170._12_4_ = fVar203;
                      auVar89._4_4_ = fStack_7bc;
                      auVar89._0_4_ = local_7c0;
                      auVar89._8_4_ = fStack_7b8;
                      auVar89._12_4_ = fStack_7b4;
                      auVar111 = vfmadd132ps_fma(auVar170,auVar220,auVar89);
                      auVar199._4_4_ = fVar212;
                      auVar199._0_4_ = fVar212;
                      auVar199._8_4_ = fVar212;
                      auVar199._12_4_ = fVar212;
                      auVar90._8_8_ = uStack_7a8;
                      auVar90._0_8_ = local_7b0;
                      auVar111 = vfmadd132ps_fma(auVar199,auVar111,auVar90);
                      auVar171._4_4_ = fVar204;
                      auVar171._0_4_ = fVar204;
                      auVar171._8_4_ = fVar204;
                      auVar171._12_4_ = fVar204;
                      auVar111 = vfmadd132ps_fma(auVar171,auVar111,auVar27);
                      auVar155 = vbroadcastss_avx512f(auVar111);
                      auVar156 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar156,ZEXT1664(auVar111));
                      auVar156 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar156,ZEXT1664(auVar111));
                      local_2c0[0] = (RTCHitN)auVar155[0];
                      local_2c0[1] = (RTCHitN)auVar155[1];
                      local_2c0[2] = (RTCHitN)auVar155[2];
                      local_2c0[3] = (RTCHitN)auVar155[3];
                      local_2c0[4] = (RTCHitN)auVar155[4];
                      local_2c0[5] = (RTCHitN)auVar155[5];
                      local_2c0[6] = (RTCHitN)auVar155[6];
                      local_2c0[7] = (RTCHitN)auVar155[7];
                      local_2c0[8] = (RTCHitN)auVar155[8];
                      local_2c0[9] = (RTCHitN)auVar155[9];
                      local_2c0[10] = (RTCHitN)auVar155[10];
                      local_2c0[0xb] = (RTCHitN)auVar155[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar155[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar155[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar155[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar155[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar155[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar155[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar155[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar155[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar155[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar155[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar155[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar155[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar155[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar155[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar155[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar155[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar155[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar155[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar155[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar155[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar155[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar155[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar155[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar155[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar155[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar155[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar155[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar155[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar155[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar155[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar155[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar155[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar155[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar155[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar155[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar155[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar155[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar155[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar155[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar155[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar155[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar155[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar155[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar155[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar155[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar155[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar155[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar155[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar155[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar155[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar155[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar155[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar155 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar155);
                      auVar131 = vpcmpeqd_avx2(auVar155._0_32_,auVar155._0_32_);
                      local_928[3] = auVar131;
                      local_928[2] = auVar131;
                      local_928[1] = auVar131;
                      *local_928 = auVar131;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instPrimID[0]));
                      local_580 = local_300;
                      local_960.valid = (int *)local_580;
                      local_960.geometryUserPtr = pGVar101->userPtr;
                      local_960.hit = local_2c0;
                      local_960.N = 0x10;
                      local_4c0._1_3_ = 0;
                      local_4c0[0] = bVar104;
                      local_4c0._4_60_ = auVar242._4_60_;
                      local_960.ray = (RTCRayN *)ray;
                      if (pGVar101->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar101->intersectionFilterN)(&local_960);
                        auVar131 = vmovdqa64_avx512vl(local_4e0);
                        auVar250 = ZEXT3264(auVar131);
                        auVar248 = ZEXT3264(local_820);
                        auVar180 = ZEXT3264(local_800);
                        auVar247 = ZEXT3264(local_7e0);
                        auVar249 = ZEXT3264(local_920);
                        auVar238 = ZEXT3264(local_900);
                        auVar245 = ZEXT3264(local_740);
                        auVar244 = ZEXT3264(local_700);
                        auVar243 = ZEXT3264(local_720);
                        auVar111 = vxorps_avx512vl(auVar112,auVar112);
                        auVar246 = ZEXT1664(auVar111);
                        pGVar101 = local_930;
                        bVar104 = local_4c0[0];
                      }
                      auVar111 = auVar246._0_16_;
                      auVar242 = vmovdqa64_avx512f(local_580);
                      uVar165 = vptestmd_avx512f(auVar242,auVar242);
                      if ((short)uVar165 == 0) {
LAB_01c18c4c:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_7a0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar101->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_960);
                          bVar104 = local_4c0[0];
                          auVar131 = vmovdqa64_avx512vl(local_4e0);
                          auVar250 = ZEXT3264(auVar131);
                          auVar248 = ZEXT3264(local_820);
                          auVar180 = ZEXT3264(local_800);
                          auVar247 = ZEXT3264(local_7e0);
                          auVar249 = ZEXT3264(local_920);
                          auVar238 = ZEXT3264(local_900);
                          auVar245 = ZEXT3264(local_740);
                          auVar244 = ZEXT3264(local_700);
                          auVar243 = ZEXT3264(local_720);
                          auVar111 = vxorps_avx512vl(auVar111,auVar111);
                          auVar246 = ZEXT1664(auVar111);
                          pGVar101 = local_930;
                        }
                        auVar242 = vmovdqa64_avx512f(local_580);
                        uVar35 = vptestmd_avx512f(auVar242,auVar242);
                        if ((short)uVar35 == 0) goto LAB_01c18c4c;
                        iVar1 = *(int *)(local_960.hit + 4);
                        iVar2 = *(int *)(local_960.hit + 8);
                        iVar76 = *(int *)(local_960.hit + 0xc);
                        iVar77 = *(int *)(local_960.hit + 0x10);
                        iVar78 = *(int *)(local_960.hit + 0x14);
                        iVar79 = *(int *)(local_960.hit + 0x18);
                        iVar80 = *(int *)(local_960.hit + 0x1c);
                        iVar81 = *(int *)(local_960.hit + 0x20);
                        iVar82 = *(int *)(local_960.hit + 0x24);
                        iVar83 = *(int *)(local_960.hit + 0x28);
                        iVar84 = *(int *)(local_960.hit + 0x2c);
                        iVar85 = *(int *)(local_960.hit + 0x30);
                        iVar86 = *(int *)(local_960.hit + 0x34);
                        iVar87 = *(int *)(local_960.hit + 0x38);
                        iVar88 = *(int *)(local_960.hit + 0x3c);
                        bVar96 = (byte)uVar35;
                        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar95 = (byte)(uVar35 >> 8);
                        bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar26 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x300) =
                             (uint)(bVar96 & 1) * *(int *)local_960.hit |
                             (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x300);
                        *(uint *)(local_960.ray + 0x304) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x304);
                        *(uint *)(local_960.ray + 0x308) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x308);
                        *(uint *)(local_960.ray + 0x30c) =
                             (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x30c)
                        ;
                        *(uint *)(local_960.ray + 0x310) =
                             (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x310)
                        ;
                        *(uint *)(local_960.ray + 0x314) =
                             (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x314)
                        ;
                        *(uint *)(local_960.ray + 0x318) =
                             (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x318)
                        ;
                        *(uint *)(local_960.ray + 0x31c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x31c)
                        ;
                        *(uint *)(local_960.ray + 800) =
                             (uint)(bVar95 & 1) * iVar81 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 800);
                        *(uint *)(local_960.ray + 0x324) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x324)
                        ;
                        *(uint *)(local_960.ray + 0x328) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x328)
                        ;
                        *(uint *)(local_960.ray + 0x32c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x32c)
                        ;
                        *(uint *)(local_960.ray + 0x330) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x330)
                        ;
                        *(uint *)(local_960.ray + 0x334) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x334)
                        ;
                        *(uint *)(local_960.ray + 0x338) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x338)
                        ;
                        *(uint *)(local_960.ray + 0x33c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x44);
                        iVar2 = *(int *)(local_960.hit + 0x48);
                        iVar76 = *(int *)(local_960.hit + 0x4c);
                        iVar77 = *(int *)(local_960.hit + 0x50);
                        iVar78 = *(int *)(local_960.hit + 0x54);
                        iVar79 = *(int *)(local_960.hit + 0x58);
                        iVar80 = *(int *)(local_960.hit + 0x5c);
                        iVar81 = *(int *)(local_960.hit + 0x60);
                        iVar82 = *(int *)(local_960.hit + 100);
                        iVar83 = *(int *)(local_960.hit + 0x68);
                        iVar84 = *(int *)(local_960.hit + 0x6c);
                        iVar85 = *(int *)(local_960.hit + 0x70);
                        iVar86 = *(int *)(local_960.hit + 0x74);
                        iVar87 = *(int *)(local_960.hit + 0x78);
                        iVar88 = *(int *)(local_960.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar26 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x340) =
                             (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x40) |
                             (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x340);
                        *(uint *)(local_960.ray + 0x344) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x344);
                        *(uint *)(local_960.ray + 0x348) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x348);
                        *(uint *)(local_960.ray + 0x34c) =
                             (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x34c)
                        ;
                        *(uint *)(local_960.ray + 0x350) =
                             (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x350)
                        ;
                        *(uint *)(local_960.ray + 0x354) =
                             (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x354)
                        ;
                        *(uint *)(local_960.ray + 0x358) =
                             (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x358)
                        ;
                        *(uint *)(local_960.ray + 0x35c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x35c)
                        ;
                        *(uint *)(local_960.ray + 0x360) =
                             (uint)(bVar95 & 1) * iVar81 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x360);
                        *(uint *)(local_960.ray + 0x364) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x364)
                        ;
                        *(uint *)(local_960.ray + 0x368) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x368)
                        ;
                        *(uint *)(local_960.ray + 0x36c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x36c)
                        ;
                        *(uint *)(local_960.ray + 0x370) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x370)
                        ;
                        *(uint *)(local_960.ray + 0x374) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x374)
                        ;
                        *(uint *)(local_960.ray + 0x378) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x378)
                        ;
                        *(uint *)(local_960.ray + 0x37c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x84);
                        iVar2 = *(int *)(local_960.hit + 0x88);
                        iVar76 = *(int *)(local_960.hit + 0x8c);
                        iVar77 = *(int *)(local_960.hit + 0x90);
                        iVar78 = *(int *)(local_960.hit + 0x94);
                        iVar79 = *(int *)(local_960.hit + 0x98);
                        iVar80 = *(int *)(local_960.hit + 0x9c);
                        iVar81 = *(int *)(local_960.hit + 0xa0);
                        iVar82 = *(int *)(local_960.hit + 0xa4);
                        iVar83 = *(int *)(local_960.hit + 0xa8);
                        iVar84 = *(int *)(local_960.hit + 0xac);
                        iVar85 = *(int *)(local_960.hit + 0xb0);
                        iVar86 = *(int *)(local_960.hit + 0xb4);
                        iVar87 = *(int *)(local_960.hit + 0xb8);
                        iVar88 = *(int *)(local_960.hit + 0xbc);
                        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar26 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x380) =
                             (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x80) |
                             (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x380);
                        *(uint *)(local_960.ray + 900) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 900);
                        *(uint *)(local_960.ray + 0x388) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x388);
                        *(uint *)(local_960.ray + 0x38c) =
                             (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x38c)
                        ;
                        *(uint *)(local_960.ray + 0x390) =
                             (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x390)
                        ;
                        *(uint *)(local_960.ray + 0x394) =
                             (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x394)
                        ;
                        *(uint *)(local_960.ray + 0x398) =
                             (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x398)
                        ;
                        *(uint *)(local_960.ray + 0x39c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x39c)
                        ;
                        *(uint *)(local_960.ray + 0x3a0) =
                             (uint)(bVar95 & 1) * iVar81 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x3a0);
                        *(uint *)(local_960.ray + 0x3a4) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3a4)
                        ;
                        *(uint *)(local_960.ray + 0x3a8) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x3a8)
                        ;
                        *(uint *)(local_960.ray + 0x3ac) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ac)
                        ;
                        *(uint *)(local_960.ray + 0x3b0) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3b0)
                        ;
                        *(uint *)(local_960.ray + 0x3b4) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3b4)
                        ;
                        *(uint *)(local_960.ray + 0x3b8) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3b8)
                        ;
                        *(uint *)(local_960.ray + 0x3bc) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0xc4);
                        iVar2 = *(int *)(local_960.hit + 200);
                        iVar76 = *(int *)(local_960.hit + 0xcc);
                        iVar77 = *(int *)(local_960.hit + 0xd0);
                        iVar78 = *(int *)(local_960.hit + 0xd4);
                        iVar79 = *(int *)(local_960.hit + 0xd8);
                        iVar80 = *(int *)(local_960.hit + 0xdc);
                        iVar81 = *(int *)(local_960.hit + 0xe0);
                        iVar82 = *(int *)(local_960.hit + 0xe4);
                        iVar83 = *(int *)(local_960.hit + 0xe8);
                        iVar84 = *(int *)(local_960.hit + 0xec);
                        iVar85 = *(int *)(local_960.hit + 0xf0);
                        iVar86 = *(int *)(local_960.hit + 0xf4);
                        iVar87 = *(int *)(local_960.hit + 0xf8);
                        iVar88 = *(int *)(local_960.hit + 0xfc);
                        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar26 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x3c0) =
                             (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0xc0) |
                             (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x3c0);
                        *(uint *)(local_960.ray + 0x3c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x3c4);
                        *(uint *)(local_960.ray + 0x3c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x3c8);
                        *(uint *)(local_960.ray + 0x3cc) =
                             (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x3cc)
                        ;
                        *(uint *)(local_960.ray + 0x3d0) =
                             (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x3d0)
                        ;
                        *(uint *)(local_960.ray + 0x3d4) =
                             (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x3d4)
                        ;
                        *(uint *)(local_960.ray + 0x3d8) =
                             (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x3d8)
                        ;
                        *(uint *)(local_960.ray + 0x3dc) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x3dc)
                        ;
                        *(uint *)(local_960.ray + 0x3e0) =
                             (uint)(bVar95 & 1) * iVar81 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x3e0);
                        *(uint *)(local_960.ray + 0x3e4) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3e4)
                        ;
                        *(uint *)(local_960.ray + 1000) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 1000);
                        *(uint *)(local_960.ray + 0x3ec) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ec)
                        ;
                        *(uint *)(local_960.ray + 0x3f0) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3f0)
                        ;
                        *(uint *)(local_960.ray + 0x3f4) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3f4)
                        ;
                        *(uint *)(local_960.ray + 0x3f8) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3f8)
                        ;
                        *(uint *)(local_960.ray + 0x3fc) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x104);
                        iVar2 = *(int *)(local_960.hit + 0x108);
                        iVar76 = *(int *)(local_960.hit + 0x10c);
                        iVar77 = *(int *)(local_960.hit + 0x110);
                        iVar78 = *(int *)(local_960.hit + 0x114);
                        iVar79 = *(int *)(local_960.hit + 0x118);
                        iVar80 = *(int *)(local_960.hit + 0x11c);
                        iVar81 = *(int *)(local_960.hit + 0x120);
                        iVar82 = *(int *)(local_960.hit + 0x124);
                        iVar83 = *(int *)(local_960.hit + 0x128);
                        iVar84 = *(int *)(local_960.hit + 300);
                        iVar85 = *(int *)(local_960.hit + 0x130);
                        iVar86 = *(int *)(local_960.hit + 0x134);
                        iVar87 = *(int *)(local_960.hit + 0x138);
                        iVar88 = *(int *)(local_960.hit + 0x13c);
                        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar35 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar35 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar35 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar35 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar35 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar35 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar35 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar35 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar35 >> 0xe) & 1);
                        bVar26 = SUB81(uVar35 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x400) =
                             (uint)(bVar96 & 1) * *(int *)(local_960.hit + 0x100) |
                             (uint)!(bool)(bVar96 & 1) * *(int *)(local_960.ray + 0x400);
                        *(uint *)(local_960.ray + 0x404) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x404);
                        *(uint *)(local_960.ray + 0x408) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x408);
                        *(uint *)(local_960.ray + 0x40c) =
                             (uint)bVar15 * iVar76 | (uint)!bVar15 * *(int *)(local_960.ray + 0x40c)
                        ;
                        *(uint *)(local_960.ray + 0x410) =
                             (uint)bVar16 * iVar77 | (uint)!bVar16 * *(int *)(local_960.ray + 0x410)
                        ;
                        *(uint *)(local_960.ray + 0x414) =
                             (uint)bVar17 * iVar78 | (uint)!bVar17 * *(int *)(local_960.ray + 0x414)
                        ;
                        *(uint *)(local_960.ray + 0x418) =
                             (uint)bVar18 * iVar79 | (uint)!bVar18 * *(int *)(local_960.ray + 0x418)
                        ;
                        *(uint *)(local_960.ray + 0x41c) =
                             (uint)bVar19 * iVar80 | (uint)!bVar19 * *(int *)(local_960.ray + 0x41c)
                        ;
                        *(uint *)(local_960.ray + 0x420) =
                             (uint)(bVar95 & 1) * iVar81 |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_960.ray + 0x420);
                        *(uint *)(local_960.ray + 0x424) =
                             (uint)bVar20 * iVar82 | (uint)!bVar20 * *(int *)(local_960.ray + 0x424)
                        ;
                        *(uint *)(local_960.ray + 0x428) =
                             (uint)bVar21 * iVar83 | (uint)!bVar21 * *(int *)(local_960.ray + 0x428)
                        ;
                        *(uint *)(local_960.ray + 0x42c) =
                             (uint)bVar22 * iVar84 | (uint)!bVar22 * *(int *)(local_960.ray + 0x42c)
                        ;
                        *(uint *)(local_960.ray + 0x430) =
                             (uint)bVar23 * iVar85 | (uint)!bVar23 * *(int *)(local_960.ray + 0x430)
                        ;
                        *(uint *)(local_960.ray + 0x434) =
                             (uint)bVar24 * iVar86 | (uint)!bVar24 * *(int *)(local_960.ray + 0x434)
                        ;
                        *(uint *)(local_960.ray + 0x438) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_960.ray + 0x438)
                        ;
                        *(uint *)(local_960.ray + 0x43c) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_960.ray + 0x43c)
                        ;
                        auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x140));
                        auVar242 = vmovdqu32_avx512f(auVar242);
                        *(undefined1 (*) [64])(local_960.ray + 0x440) = auVar242;
                        auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x180));
                        auVar242 = vmovdqu32_avx512f(auVar242);
                        *(undefined1 (*) [64])(local_960.ray + 0x480) = auVar242;
                        auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x1c0));
                        auVar242 = vmovdqa32_avx512f(auVar242);
                        *(undefined1 (*) [64])(local_960.ray + 0x4c0) = auVar242;
                        auVar242 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x200));
                        auVar242 = vmovdqa32_avx512f(auVar242);
                        *(undefined1 (*) [64])(local_960.ray + 0x500) = auVar242;
                      }
                      bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar104;
                      uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar49._4_4_ = uVar164;
                      auVar49._0_4_ = uVar164;
                      auVar49._8_4_ = uVar164;
                      auVar49._12_4_ = uVar164;
                      auVar49._16_4_ = uVar164;
                      auVar49._20_4_ = uVar164;
                      auVar49._24_4_ = uVar164;
                      auVar49._28_4_ = uVar164;
                      uVar165 = vcmpps_avx512vl(local_8a0,auVar49,2);
                      bVar104 = bVar96 & (byte)uVar165;
                      if ((bVar96 & (byte)uVar165) != 0) {
                        auVar178._8_4_ = 0x7f800000;
                        auVar178._0_8_ = 0x7f8000007f800000;
                        auVar178._12_4_ = 0x7f800000;
                        auVar178._16_4_ = 0x7f800000;
                        auVar178._20_4_ = 0x7f800000;
                        auVar178._24_4_ = 0x7f800000;
                        auVar178._28_4_ = 0x7f800000;
                        auVar131 = vblendmps_avx512vl(auVar178,local_8a0);
                        auVar153._0_4_ =
                             (uint)(bVar104 & 1) * auVar131._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 1 & 1);
                        auVar153._4_4_ = (uint)bVar13 * auVar131._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 2 & 1);
                        auVar153._8_4_ = (uint)bVar13 * auVar131._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 3 & 1);
                        auVar153._12_4_ =
                             (uint)bVar13 * auVar131._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 4 & 1);
                        auVar153._16_4_ =
                             (uint)bVar13 * auVar131._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 5 & 1);
                        auVar153._20_4_ =
                             (uint)bVar13 * auVar131._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar104 >> 6 & 1);
                        auVar153._24_4_ =
                             (uint)bVar13 * auVar131._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar153._28_4_ =
                             (uint)(bVar104 >> 7) * auVar131._28_4_ |
                             (uint)!(bool)(bVar104 >> 7) * 0x7f800000;
                        auVar131 = vshufps_avx(auVar153,auVar153,0xb1);
                        auVar131 = vminps_avx(auVar153,auVar131);
                        auVar133 = vshufpd_avx(auVar131,auVar131,5);
                        auVar131 = vminps_avx(auVar131,auVar133);
                        auVar133 = vpermpd_avx2(auVar131,0x4e);
                        auVar131 = vminps_avx(auVar131,auVar133);
                        uVar165 = vcmpps_avx512vl(auVar153,auVar131,0);
                        bVar95 = (byte)uVar165 & bVar104;
                        bVar96 = bVar104;
                        if (bVar95 != 0) {
                          bVar96 = bVar95;
                        }
                        uVar36 = 0;
                        for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0;
                            uVar98 = uVar98 >> 1 | 0x80000000) {
                          uVar36 = uVar36 + 1;
                        }
                        uVar97 = (ulong)uVar36;
                      }
                    } while (bVar104 != 0);
                  }
                }
              }
            }
          }
          lVar99 = lVar99 + 8;
          auVar242 = auVar238;
        } while ((int)lVar99 < iVar8);
      }
      uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar164;
      auVar41._0_4_ = uVar164;
      auVar41._8_4_ = uVar164;
      auVar41._12_4_ = uVar164;
      uVar165 = vcmpps_avx512vl(local_4f0,auVar41,2);
      uVar102 = (uint)uVar103 & (uint)uVar103 + 0xf & (uint)uVar165;
      uVar103 = (ulong)uVar102;
    } while (uVar102 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }